

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.c
# Opt level: O0

void convolve_2d_sr_general_avx2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  __m256i data_00;
  __m256i data_01;
  __m256i data_02;
  __m256i data_03;
  __m256i data_04;
  __m256i data_05;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar117 [16];
  uint uVar106;
  uint uVar107;
  int iVar108;
  int iVar109;
  long lVar110;
  undefined8 *puVar111;
  undefined8 *puVar112;
  int in_ECX;
  long lVar113;
  int iVar114;
  long in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  int in_ESI;
  undefined1 *puVar115;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 uVar116;
  undefined8 uVar121;
  undefined1 auVar118 [32];
  undefined1 auVar122 [16];
  undefined8 uVar124;
  undefined1 auVar123 [16];
  undefined8 uVar120;
  undefined1 auVar119 [32];
  undefined1 auVar125 [64];
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i v_03;
  __m128i v_04;
  __m128i v_05;
  __m128i v_06;
  long in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m128i *p_1_3;
  __m128i *p_0_3;
  __m128i res_1_4;
  __m128i res_0_4;
  __m256i res_8b_3;
  __m256i res_16bit_3;
  __m256i res_b_round_3;
  __m256i res_a_round_3;
  __m256i res_b_3;
  __m256i res_a_3;
  __m256i s7_2;
  __m256i s6_2;
  int16_t *data_9;
  __m256i s_3 [8];
  __m256i src_5_1;
  __m256i src_4_1;
  __m256i src_3_3;
  __m256i src_2_3;
  __m256i src_1_3;
  __m256i src_0_3;
  __m128i *p_1_2;
  __m128i *p_0_2;
  __m128i res_1_3;
  __m128i res_0_3;
  __m256i res_8b_2;
  __m256i res_16bit_2;
  __m256i res_b_round_2;
  __m256i res_a_round_2;
  __m256i res_b_2;
  __m256i res_a_2;
  __m256i s7_1;
  __m256i s6_1;
  int16_t *data_8;
  __m256i s_2 [8];
  __m256i src_3_2;
  __m256i src_2_2;
  __m256i src_1_2;
  __m256i src_0_2;
  __m128i *p_1_1;
  __m128i *p_0_1;
  __m128i res_1_2;
  __m128i res_0_2;
  __m256i res_8b_1;
  __m256i res_16bit_1;
  __m256i res_b_round_1;
  __m256i res_a_round_1;
  __m256i res_b_1;
  __m256i res_a_1;
  __m256i s5;
  __m256i s4;
  int16_t *data_7;
  __m256i src_3_1;
  __m256i src_2_1;
  __m256i src_1_1;
  __m256i src_0_1;
  __m256i s_1 [6];
  __m256i res_5;
  __m256i data_1_2;
  __m256i res_6;
  __m256i data_6;
  __m256i res_3;
  __m256i data_1_1;
  __m256i res_4;
  __m256i data_5;
  __m256i res;
  __m256i data_1;
  __m256i res_2;
  __m256i data_4;
  int j_1;
  uint8_t *src_ptr_1;
  int fo_horiz_1;
  int fo_vert_1;
  int im_h_1;
  int vert_tap_1;
  int horiz_tap_1;
  __m256i coeffs_v_1 [4];
  __m256i coeffs_h_1 [4];
  __m256i filt [4];
  __m128i round_shift_v_1;
  __m256i round_const_v_1;
  __m128i sum_shift_v_1;
  __m256i sum_round_v_1;
  __m128i round_shift_h;
  __m256i round_const_h;
  int offset_bits_1;
  int bits_1;
  int16_t im_block_1 [1120];
  int i_1;
  int im_stride_1;
  int bd_1;
  __m128i *p_1;
  __m128i *p_0;
  __m128i res_1_1;
  __m128i res_0_1;
  __m256i res_8b;
  __m256i res_16bit;
  __m256i res_b_round;
  __m256i res_a_round;
  __m256i res_b;
  __m256i res_a;
  __m256i s7;
  __m256i s6;
  int16_t *data_3;
  __m256i src_9;
  __m256i src_8;
  __m256i src_7;
  __m256i src_6;
  __m256i src_5;
  __m256i src_4;
  __m256i src_3;
  __m256i src_2;
  __m256i src_1;
  __m256i src_0;
  __m256i res_16b_lo_1;
  __m256i res_32b_lo_1;
  __m256i res_lo_1;
  __m256i s_hihi_1;
  __m256i s_hilo_1;
  __m256i s_lohi_1;
  __m256i s_lolo_1;
  __m256i s_16hi_1;
  __m256i s_16lo_1;
  __m256i data_2;
  uint32_t horiz_2;
  __m128i res_1;
  __m128i res_0;
  __m256i res_16b_lo;
  __m256i res_32b_lo;
  __m256i res_lo;
  __m256i s_hihi;
  __m256i s_hilo;
  __m256i s_lohi;
  __m256i s_lolo;
  __m256i s_16hi;
  __m256i s_16lo;
  __m256i data;
  __m256i s [12];
  __m256i v_zero;
  int j;
  uint8_t *src_ptr;
  int fo_horiz;
  int fo_vert;
  int im_h;
  int vert_tap;
  int horiz_tap;
  __m256i coeffs_v [6];
  __m256i coeffs_h [6];
  __m128i round_shift_v;
  __m256i round_const_v;
  __m128i sum_shift_v;
  __m256i sum_round_v;
  __m128i round_shift_h12;
  __m256i round_const_h12;
  int offset_bits;
  int bits;
  int16_t im_block [1120];
  int i;
  int im_stride;
  int bd;
  int in_stack_ffffffffffffb48c;
  InterpFilterParams *in_stack_ffffffffffffb490;
  __m256i *in_stack_ffffffffffffb4b8;
  int in_stack_ffffffffffffb4c4;
  undefined4 in_stack_ffffffffffffb4c8;
  undefined4 in_stack_ffffffffffffb4cc;
  __m256i *in_stack_ffffffffffffb4d0;
  InterpFilterParams *in_stack_ffffffffffffb4d8;
  __m256i *in_stack_ffffffffffffb4e0;
  undefined4 in_stack_ffffffffffffb4e8;
  int in_stack_ffffffffffffb4ec;
  InterpFilterParams *in_stack_ffffffffffffb4f0;
  InterpFilterParams *local_4b00;
  __m256i *in_stack_ffffffffffffb508;
  __m256i *in_stack_ffffffffffffb510;
  undefined8 in_stack_ffffffffffffb518;
  undefined8 in_stack_ffffffffffffb520;
  __m256i *in_stack_ffffffffffffb528;
  __m256i *in_stack_ffffffffffffb530;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 local_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  __m256i *coeffs;
  __m256i *s_00;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  undefined8 local_47a0;
  undefined8 uStack_4798;
  undefined8 uStack_4790;
  undefined8 uStack_4788;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  undefined8 local_4760;
  undefined8 uStack_4758;
  undefined8 uStack_4750;
  undefined8 uStack_4748;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined1 local_42a0 [16];
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined1 local_4220 [16];
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined1 local_41a0 [16];
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  int local_4104;
  undefined1 local_40e0 [32];
  undefined1 local_40c0 [224];
  uint8_t local_3fe0 [8];
  uint8_t auStack_3fd8 [8];
  uint8_t auStack_3fd0 [8];
  uint8_t auStack_3fc8 [8];
  uint8_t local_3fc0 [8];
  uint8_t auStack_3fb8 [8];
  uint8_t auStack_3fb0 [8];
  uint8_t auStack_3fa8 [8];
  uint8_t local_3fa0 [8];
  uint8_t auStack_3f98 [8];
  uint8_t auStack_3f90 [8];
  uint8_t auStack_3f88 [8];
  uint8_t local_3f80 [8];
  uint8_t auStack_3f78 [8];
  uint8_t auStack_3f70 [8];
  uint8_t auStack_3f68 [24];
  ulong local_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  ulong local_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  ulong local_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  int local_3e88;
  uint local_3e84;
  undefined8 local_3e80 [280];
  int local_35bc;
  int local_35b8;
  undefined4 local_35b4;
  undefined8 *local_35b0;
  undefined8 *local_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 local_3590;
  undefined8 uStack_3588;
  undefined1 local_3580 [32];
  undefined1 local_3560 [32];
  undefined1 local_3540 [32];
  undefined1 local_3520 [32];
  undefined1 local_3500 [32];
  undefined1 local_34e0 [32];
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  long local_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined1 local_3320 [32];
  undefined1 local_3300 [32];
  undefined1 local_32e0 [32];
  undefined1 local_32c0 [32];
  undefined1 local_32a0 [32];
  undefined1 local_3280 [32];
  undefined1 local_3260 [32];
  undefined1 local_3240 [32];
  undefined1 local_3220 [32];
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined4 local_31c4;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 local_31b0;
  undefined8 uStack_31a8;
  undefined1 local_31a0 [32];
  undefined1 local_3180 [32];
  undefined1 local_3160 [32];
  undefined1 local_3140 [32];
  undefined1 local_3120 [32];
  undefined1 local_3100 [32];
  undefined1 local_30e0 [32];
  undefined1 local_30c0 [32];
  undefined1 local_30a0 [32];
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined1 local_3060 [32];
  undefined1 local_3040 [32];
  undefined1 local_3020 [32];
  undefined1 local_3000 [32];
  undefined1 local_2fe0 [32];
  undefined1 local_2fc0 [32];
  undefined1 local_2fa0 [32];
  undefined1 local_2f80 [32];
  undefined1 local_2f60 [32];
  undefined1 local_2f40 [32];
  undefined1 local_2f20 [32];
  undefined1 local_2f00 [32];
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  int local_2ea4;
  long local_2ea0;
  int local_2e94;
  int local_2e90;
  int local_2e8c;
  int local_2e88;
  int local_2e84;
  undefined1 local_2e80 [192];
  undefined1 local_2dc0 [208];
  ulong local_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  ulong local_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  ulong local_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  int local_2c28;
  uint local_2c24;
  undefined8 local_2c20;
  undefined8 auStack_2c18 [282];
  int local_2348;
  int local_2344;
  undefined4 local_2340;
  int local_233c;
  int local_2338;
  int local_2334;
  long local_2330;
  int local_2324;
  long local_2320;
  uint local_2314;
  uint local_2310;
  uint local_230c;
  uint local_2308;
  uint local_2304;
  undefined1 local_2300 [16];
  uint local_22e4;
  undefined1 local_22e0 [16];
  uint local_22c4;
  undefined1 local_22c0 [16];
  uint local_22a4;
  undefined1 local_22a0 [16];
  uint local_2284;
  undefined1 local_2280 [16];
  uint local_2264;
  undefined1 local_2260 [16];
  uint local_2244;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 local_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 local_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 local_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 local_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 *local_2168;
  undefined1 (*local_2160) [16];
  undefined1 (*local_2158) [16];
  undefined8 *local_2150;
  undefined1 (*local_2148) [16];
  undefined1 (*local_2140) [16];
  undefined8 *local_2138;
  undefined1 (*local_2130) [16];
  undefined1 (*local_2128) [16];
  undefined8 *local_2120;
  undefined1 (*local_2118) [16];
  undefined8 *local_2110;
  undefined1 (*local_2108) [16];
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  ulong local_15f0;
  undefined8 uStack_15e8;
  undefined1 local_15e0 [32];
  ulong local_15b0;
  undefined8 uStack_15a8;
  undefined1 local_15a0 [32];
  ulong local_1570;
  undefined8 uStack_1568;
  undefined1 local_1560 [32];
  ulong local_1530;
  undefined8 uStack_1528;
  undefined1 local_1520 [32];
  ulong local_14f0;
  undefined8 uStack_14e8;
  undefined1 local_14e0 [32];
  ulong local_14b0;
  undefined8 uStack_14a8;
  undefined1 local_14a0 [32];
  ulong local_1470;
  undefined8 uStack_1468;
  undefined1 local_1460 [32];
  ulong local_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [32];
  ulong local_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  ulong local_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  ulong local_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [32];
  ulong local_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  ulong local_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12e0 [32];
  ulong local_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [32];
  ulong local_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  ulong local_1230;
  undefined8 uStack_1228;
  undefined1 local_1220 [32];
  ulong local_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11e0 [32];
  ulong local_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [32];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  __m256i *local_b80;
  undefined8 uStack_b78;
  __m256i *local_b68;
  InterpFilterParams *local_b60;
  __m256i *palStack_b58;
  InterpFilterParams *local_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 *local_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 *local_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 *local_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 *local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 *local_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 *local_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 *local_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 *local_a48;
  __m256i *local_a40;
  undefined8 uStack_a38;
  __m256i *local_a30;
  undefined8 uStack_a28;
  InterpFilterParams *local_a20;
  __m256i *palStack_a18;
  InterpFilterParams *local_a10;
  __m256i *palStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined1 local_900 [16];
  undefined8 *local_8e8;
  undefined1 (*local_8e0) [32];
  undefined1 (*local_8d8) [32];
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  undefined1 (*local_8a0) [32];
  undefined1 (*local_898) [32];
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined1 (*local_870) [32];
  undefined1 (*local_868) [32];
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  undefined8 *local_848;
  undefined1 (*local_840) [32];
  undefined1 (*local_838) [32];
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 *local_818;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 local_7e0;
  __m256i *palStack_7d8;
  __m256i *palStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  __m256i *palStack_7b8;
  __m256i *palStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  InterpFilterParams *local_6e0;
  __m256i *palStack_6d8;
  __m256i *palStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  ushort local_652;
  uint8_t *local_650;
  uint8_t *local_648;
  uint8_t *local_640;
  uint8_t *local_638;
  ulong local_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  ulong local_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  ulong local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  ulong local_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  ulong local_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  ulong local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [16];
  undefined1 auStack_450 [16];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 *local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 *local_1c8;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  uint local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  uint local_184;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  
  local_233c = in_R9D;
  local_2338 = in_R8D;
  local_2334 = in_ECX;
  local_2330 = in_RDX;
  local_2324 = in_ESI;
  local_2320 = in_RDI;
  if (*(ushort *)(in_stack_00000008 + 8) < 9) {
    local_35b4 = 8;
    local_35b8 = 8;
    local_3e84 = 0xe - (*(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) +
                       *(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18));
    local_3e88 = 0x16 - *(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14);
    local_652 = (short)((uint)(1 << (*(char *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) - 1U
                                    & 0x1f)) >> 1) + 0x2000;
    auVar117 = vpinsrw_avx(ZEXT216(local_652),(uint)local_652,1);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,2);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,3);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,4);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,5);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,6);
    local_80 = vpinsrw_avx(auVar117,(uint)local_652,7);
    auVar117 = vpinsrw_avx(ZEXT216(local_652),(uint)local_652,1);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,2);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,3);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,4);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,5);
    auVar117 = vpinsrw_avx(auVar117,(uint)local_652,6);
    auStack_70 = vpinsrw_avx(auVar117,(uint)local_652,7);
    local_3ec0 = local_80._0_8_;
    uStack_3eb8 = local_80._8_8_;
    uStack_3eb0 = auStack_70._0_8_;
    uStack_3ea8 = auStack_70._8_8_;
    local_22a4 = *(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) - 1;
    local_22c0._4_4_ = 0;
    local_22c0._0_4_ = local_22a4;
    local_3ed0 = local_22c0._0_8_;
    uStack_3ec8 = 0;
    local_2310 = (1 << ((byte)local_3e88 & 0x1f)) +
                 ((1 << (*(byte *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18) & 0x1f)) >> 1);
    auVar117 = vpinsrd_avx(ZEXT416(local_2310),local_2310,1);
    auVar117 = vpinsrd_avx(auVar117,local_2310,2);
    local_100 = vpinsrd_avx(auVar117,local_2310,3);
    auVar117 = vpinsrd_avx(ZEXT416(local_2310),local_2310,1);
    auVar117 = vpinsrd_avx(auVar117,local_2310,2);
    auStack_f0 = vpinsrd_avx(auVar117,local_2310,3);
    local_3f00 = local_100._0_8_;
    uStack_3ef8 = local_100._8_8_;
    uStack_3ef0 = auStack_f0._0_8_;
    uStack_3ee8 = auStack_f0._8_8_;
    local_22c4 = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18);
    local_22e0._4_4_ = 0;
    local_22e0._0_4_ = local_22c4;
    local_3f10 = local_22e0._0_8_;
    uStack_3f08 = 0;
    iVar114 = 1 << ((byte)local_3e88 -
                    (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18) & 0x1f);
    local_2314 = (((1 << ((byte)local_3e84 & 0x1f)) >> 1) - iVar114) - (iVar114 >> 1);
    auVar117 = vpinsrd_avx(ZEXT416(local_2314),local_2314,1);
    auVar117 = vpinsrd_avx(auVar117,local_2314,2);
    local_c0 = vpinsrd_avx(auVar117,local_2314,3);
    auVar117 = vpinsrd_avx(ZEXT416(local_2314),local_2314,1);
    auVar117 = vpinsrd_avx(auVar117,local_2314,2);
    auStack_b0 = vpinsrd_avx(auVar117,local_2314,3);
    local_3f40 = local_c0._0_8_;
    uStack_3f38 = local_c0._8_8_;
    uStack_3f30 = auStack_b0._0_8_;
    uStack_3f28 = auStack_b0._8_8_;
    local_2300._4_4_ = 0;
    local_2300._0_4_ = local_3e84;
    local_3f50 = local_2300._0_8_;
    uStack_3f48 = 0;
    auVar125 = ZEXT1664(auStack_b0);
    local_2300 = ZEXT416(local_3e84);
    local_22e4 = local_3e84;
    local_22e0 = ZEXT416(local_22c4);
    local_22c0 = ZEXT416(local_22a4);
    local_e0 = local_2310;
    local_dc = local_2310;
    local_d8 = local_2310;
    local_d4 = local_2310;
    local_d0 = local_2310;
    local_cc = local_2310;
    local_c8 = local_2310;
    local_c4 = local_2310;
    local_a0 = local_2314;
    local_9c = local_2314;
    local_98 = local_2314;
    local_94 = local_2314;
    local_90 = local_2314;
    local_8c = local_2314;
    local_88 = local_2314;
    local_84 = local_2314;
    local_50 = local_652;
    local_4e = local_652;
    local_4c = local_652;
    local_4a = local_652;
    local_48 = local_652;
    local_46 = local_652;
    local_44 = local_652;
    local_42 = local_652;
    local_40 = local_652;
    local_3e = local_652;
    local_3c = local_652;
    local_3a = local_652;
    local_38 = local_652;
    local_36 = local_652;
    local_34 = local_652;
    local_32 = local_652;
    prepare_coeffs_lowbd
              (in_stack_ffffffffffffb4f0,in_stack_ffffffffffffb4ec,in_stack_ffffffffffffb4e0);
    prepare_coeffs((InterpFilterParams *)
                   CONCAT44(in_stack_ffffffffffffb4cc,in_stack_ffffffffffffb4c8),
                   in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4b8);
    iVar114 = get_filter_tap(in_stack_ffffffffffffb490,in_stack_ffffffffffffb48c);
    iVar108 = get_filter_tap(in_stack_ffffffffffffb490,in_stack_ffffffffffffb48c);
    if (iVar114 == 6) {
      prepare_coeffs_6t_lowbd
                (in_stack_ffffffffffffb4f0,in_stack_ffffffffffffb4ec,in_stack_ffffffffffffb4e0);
      local_4b00 = in_stack_ffffffffffffb4f0;
    }
    else {
      prepare_coeffs_lowbd
                (in_stack_ffffffffffffb4f0,in_stack_ffffffffffffb4ec,in_stack_ffffffffffffb4e0);
      local_4b00 = in_stack_ffffffffffffb4f0;
    }
    if (iVar108 == 6) {
      prepare_coeffs_6t((InterpFilterParams *)
                        CONCAT44(in_stack_ffffffffffffb4cc,in_stack_ffffffffffffb4c8),
                        in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4b8);
    }
    else {
      prepare_coeffs((InterpFilterParams *)
                     CONCAT44(in_stack_ffffffffffffb4cc,in_stack_ffffffffffffb4c8),
                     in_stack_ffffffffffffb4c4,in_stack_ffffffffffffb4b8);
    }
    iVar109 = local_233c + iVar108;
    lVar110 = (local_2320 - (iVar108 / 2 + -1) * local_2324) - (long)(iVar114 / 2 + -1);
    local_638 = "";
    local_3fe0[0] = '\0';
    local_3fe0[1] = '\x01';
    local_3fe0[2] = '\x01';
    local_3fe0[3] = '\x02';
    local_3fe0[4] = '\x02';
    local_3fe0[5] = '\x03';
    local_3fe0[6] = '\x03';
    local_3fe0[7] = '\x04';
    auStack_3fd8[0] = '\x04';
    auStack_3fd8[1] = '\x05';
    auStack_3fd8[2] = '\x05';
    auStack_3fd8[3] = '\x06';
    auStack_3fd8[4] = '\x06';
    auStack_3fd8[5] = '\a';
    auStack_3fd8[6] = '\a';
    auStack_3fd8[7] = '\b';
    auStack_3fd0[0] = '\0';
    auStack_3fd0[1] = '\x01';
    auStack_3fd0[2] = '\x01';
    auStack_3fd0[3] = '\x02';
    auStack_3fd0[4] = '\x02';
    auStack_3fd0[5] = '\x03';
    auStack_3fd0[6] = '\x03';
    auStack_3fd0[7] = '\x04';
    auStack_3fc8[0] = '\x04';
    auStack_3fc8[1] = '\x05';
    auStack_3fc8[2] = '\x05';
    auStack_3fc8[3] = '\x06';
    auStack_3fc8[4] = '\x06';
    auStack_3fc8[5] = '\a';
    auStack_3fc8[6] = '\a';
    auStack_3fc8[7] = '\b';
    local_640 = 
    "\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n"
    ;
    local_3fc0[0] = '\x02';
    local_3fc0[1] = '\x03';
    local_3fc0[2] = '\x03';
    local_3fc0[3] = '\x04';
    local_3fc0[4] = '\x04';
    local_3fc0[5] = '\x05';
    local_3fc0[6] = '\x05';
    local_3fc0[7] = '\x06';
    auStack_3fb8[0] = '\x06';
    auStack_3fb8[1] = '\a';
    auStack_3fb8[2] = '\a';
    auStack_3fb8[3] = '\b';
    auStack_3fb8[4] = '\b';
    auStack_3fb8[5] = '\t';
    auStack_3fb8[6] = '\t';
    auStack_3fb8[7] = '\n';
    auStack_3fb0[0] = '\x02';
    auStack_3fb0[1] = '\x03';
    auStack_3fb0[2] = '\x03';
    auStack_3fb0[3] = '\x04';
    auStack_3fb0[4] = '\x04';
    auStack_3fb0[5] = '\x05';
    auStack_3fb0[6] = '\x05';
    auStack_3fb0[7] = '\x06';
    auStack_3fa8[0] = '\x06';
    auStack_3fa8[1] = '\a';
    auStack_3fa8[2] = '\a';
    auStack_3fa8[3] = '\b';
    auStack_3fa8[4] = '\b';
    auStack_3fa8[5] = '\t';
    auStack_3fa8[6] = '\t';
    auStack_3fa8[7] = '\n';
    local_648 = 
    "\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f";
    local_3fa0[0] = '\x04';
    local_3fa0[1] = '\x05';
    local_3fa0[2] = '\x05';
    local_3fa0[3] = '\x06';
    local_3fa0[4] = '\x06';
    local_3fa0[5] = '\a';
    local_3fa0[6] = '\a';
    local_3fa0[7] = '\b';
    auStack_3f98[0] = '\b';
    auStack_3f98[1] = '\t';
    auStack_3f98[2] = '\t';
    auStack_3f98[3] = '\n';
    auStack_3f98[4] = '\n';
    auStack_3f98[5] = '\v';
    auStack_3f98[6] = '\v';
    auStack_3f98[7] = '\f';
    auStack_3f90[0] = '\x04';
    auStack_3f90[1] = '\x05';
    auStack_3f90[2] = '\x05';
    auStack_3f90[3] = '\x06';
    auStack_3f90[4] = '\x06';
    auStack_3f90[5] = '\a';
    auStack_3f90[6] = '\a';
    auStack_3f90[7] = '\b';
    auStack_3f88[0] = '\b';
    auStack_3f88[1] = '\t';
    auStack_3f88[2] = '\t';
    auStack_3f88[3] = '\n';
    auStack_3f88[4] = '\n';
    auStack_3f88[5] = '\v';
    auStack_3f88[6] = '\v';
    auStack_3f88[7] = '\f';
    local_650 = "\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e";
    local_3f80[0] = '\x06';
    local_3f80[1] = '\a';
    local_3f80[2] = '\a';
    local_3f80[3] = '\b';
    local_3f80[4] = '\b';
    local_3f80[5] = '\t';
    local_3f80[6] = '\t';
    local_3f80[7] = '\n';
    auStack_3f78[0] = '\n';
    auStack_3f78[1] = '\v';
    auStack_3f78[2] = '\v';
    auStack_3f78[3] = '\f';
    auStack_3f78[4] = '\f';
    auStack_3f78[5] = '\r';
    auStack_3f78[6] = '\r';
    auStack_3f78[7] = '\x0e';
    auStack_3f70[0] = '\x06';
    auStack_3f70[1] = '\a';
    auStack_3f70[2] = '\a';
    auStack_3f70[3] = '\b';
    auStack_3f70[4] = '\b';
    auStack_3f70[5] = '\t';
    auStack_3f70[6] = '\t';
    auStack_3f70[7] = '\n';
    auStack_3f68[0] = '\n';
    auStack_3f68[1] = '\v';
    auStack_3f68[2] = '\v';
    auStack_3f68[3] = '\f';
    auStack_3f68[4] = '\f';
    auStack_3f68[5] = '\r';
    auStack_3f68[6] = '\r';
    auStack_3f68[7] = '\x0e';
    for (local_4104 = 0; local_4104 < local_2338; local_4104 = local_4104 + 8) {
      if (iVar114 == 4) {
        for (local_35bc = 0; local_35bc < iVar109 + -3; local_35bc = local_35bc + 2) {
          local_2128 = (undefined1 (*) [16])(lVar110 + (local_35bc * local_2324 + local_4104));
          local_21c0 = *(undefined8 *)*local_2128;
          uStack_21b8 = *(undefined8 *)(*local_2128 + 8);
          local_2130 = (undefined1 (*) [16])
                       (lVar110 + (local_35bc * local_2324 + local_4104 + local_2324));
          auVar117 = ZEXT116(0) * *local_2130 + ZEXT116(1) * *local_2128;
          auVar122 = ZEXT116(0) * auVar125._0_16_ + ZEXT116(1) * *local_2130;
          data_00[1] = (longlong)in_stack_ffffffffffffb4e0;
          data_00[0] = (longlong)in_stack_ffffffffffffb4d8;
          data_00[2]._0_4_ = in_stack_ffffffffffffb4e8;
          data_00[2]._4_4_ = in_stack_ffffffffffffb4ec;
          data_00[3] = (longlong)local_4b00;
          convolve_lowbd_x_4tap
                    (data_00,in_stack_ffffffffffffb4d0,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffb4cc,in_stack_ffffffffffffb4c8));
          local_380 = local_3ec0;
          uStack_378 = uStack_3eb8;
          uStack_370 = uStack_3eb0;
          uStack_368 = uStack_3ea8;
          auVar97._16_8_ = auVar122._0_8_;
          auVar97._0_16_ = auVar117;
          auVar97._24_8_ = auVar122._8_8_;
          auVar96._8_8_ = uStack_3eb8;
          auVar96._0_8_ = local_3ec0;
          auVar96._16_8_ = uStack_3eb0;
          auVar96._24_8_ = uStack_3ea8;
          local_4e0 = vpaddw_avx2(auVar97,auVar96);
          local_4f0 = local_3ed0;
          uStack_4e8 = uStack_3ec8;
          auVar87._8_8_ = uStack_3ec8;
          auVar87._0_8_ = local_3ed0;
          auVar125 = ZEXT1664(auVar87);
          auVar118 = vpsraw_avx2(local_4e0,auVar87);
          lVar113 = (long)(local_35bc * local_35b8) * 2;
          local_1c8 = (undefined8 *)((long)local_3e80 + lVar113);
          local_4160 = auVar118._0_8_;
          uStack_4158 = auVar118._8_8_;
          uStack_4150 = auVar118._16_8_;
          uStack_4148 = auVar118._24_8_;
          local_200 = local_4160;
          uStack_1f8 = uStack_4158;
          uStack_1f0 = uStack_4150;
          uStack_1e8 = uStack_4148;
          *local_1c8 = local_4160;
          *(undefined8 *)((long)local_3e80 + lVar113 + 8) = uStack_4158;
          *(undefined8 *)((long)local_3e80 + lVar113 + 0x10) = uStack_4150;
          *(undefined8 *)((long)local_3e80 + lVar113 + 0x18) = uStack_4148;
          local_360 = auVar117;
          auStack_350 = auVar122;
        }
        local_2138 = (undefined8 *)(lVar110 + (local_35bc * local_2324 + local_4104));
        uVar116 = *local_2138;
        uVar120 = local_2138[1];
        uVar121 = 0;
        uVar124 = 0;
        data_01[1] = (longlong)in_stack_ffffffffffffb4e0;
        data_01[0] = (longlong)in_stack_ffffffffffffb4d8;
        data_01[2]._0_4_ = in_stack_ffffffffffffb4e8;
        data_01[2]._4_4_ = in_stack_ffffffffffffb4ec;
        data_01[3] = (longlong)local_4b00;
        local_21d0 = uVar116;
        uStack_21c8 = uVar120;
        convolve_lowbd_x_4tap
                  (data_01,in_stack_ffffffffffffb4d0,
                   (__m256i *)CONCAT44(in_stack_ffffffffffffb4cc,in_stack_ffffffffffffb4c8));
        local_41a0._8_8_ = uVar120;
        local_41a0._0_8_ = uVar116;
        local_3c0 = local_3ec0;
        uStack_3b8 = uStack_3eb8;
        uStack_3b0 = uStack_3eb0;
        uStack_3a8 = uStack_3ea8;
        auVar95._16_8_ = uVar121;
        auVar95._0_16_ = local_41a0;
        auVar95._24_8_ = uVar124;
        auVar94._8_8_ = uStack_3eb8;
        auVar94._0_8_ = local_3ec0;
        auVar94._16_8_ = uStack_3eb0;
        auVar94._24_8_ = uStack_3ea8;
        local_520 = vpaddw_avx2(auVar95,auVar94);
        local_530 = local_3ed0;
        uStack_528 = uStack_3ec8;
        auVar86._8_8_ = uStack_3ec8;
        auVar86._0_8_ = local_3ed0;
        auVar118 = vpsraw_avx2(local_520,auVar86);
        lVar113 = (long)(local_35bc * local_35b8) * 2;
        local_208 = (undefined8 *)((long)local_3e80 + lVar113);
        local_41a0._0_8_ = auVar118._0_8_;
        local_41a0._8_8_ = auVar118._8_8_;
        uStack_4190 = auVar118._16_8_;
        uStack_4188 = auVar118._24_8_;
        local_240 = local_41a0._0_8_;
        uStack_238 = local_41a0._8_8_;
        uStack_230 = uStack_4190;
        uStack_228 = uStack_4188;
        *local_208 = local_41a0._0_8_;
        *(undefined8 *)((long)local_3e80 + lVar113 + 8) = local_41a0._8_8_;
        *(undefined8 *)((long)local_3e80 + lVar113 + 0x10) = uStack_4190;
        *(undefined8 *)((long)local_3e80 + lVar113 + 0x18) = uStack_4188;
        local_3a0 = uVar116;
        uStack_398 = uVar120;
        uStack_390 = uVar121;
        uStack_388 = uVar124;
      }
      else if (iVar114 == 6) {
        for (local_35bc = 0; local_35bc < iVar109 + -3; local_35bc = local_35bc + 2) {
          local_2140 = (undefined1 (*) [16])(lVar110 + (local_35bc * local_2324 + local_4104));
          local_21e0 = *(undefined8 *)*local_2140;
          uStack_21d8 = *(undefined8 *)(*local_2140 + 8);
          local_2148 = (undefined1 (*) [16])
                       (lVar110 + (local_35bc * local_2324 + local_4104 + local_2324));
          auVar117 = ZEXT116(0) * *local_2148 + ZEXT116(1) * *local_2140;
          auVar122 = ZEXT116(0) * auVar125._0_16_ + ZEXT116(1) * *local_2148;
          data_02[1] = in_stack_ffffffffffffb520;
          data_02[0] = in_stack_ffffffffffffb518;
          data_02[2] = (longlong)in_stack_ffffffffffffb528;
          data_02[3] = (longlong)in_stack_ffffffffffffb530;
          convolve_lowbd_x_6tap(data_02,in_stack_ffffffffffffb510,in_stack_ffffffffffffb508);
          local_400 = local_3ec0;
          uStack_3f8 = uStack_3eb8;
          uStack_3f0 = uStack_3eb0;
          uStack_3e8 = uStack_3ea8;
          auVar93._16_8_ = auVar122._0_8_;
          auVar93._0_16_ = auVar117;
          auVar93._24_8_ = auVar122._8_8_;
          auVar92._8_8_ = uStack_3eb8;
          auVar92._0_8_ = local_3ec0;
          auVar92._16_8_ = uStack_3eb0;
          auVar92._24_8_ = uStack_3ea8;
          local_560 = vpaddw_avx2(auVar93,auVar92);
          local_570 = local_3ed0;
          uStack_568 = uStack_3ec8;
          auVar123._8_8_ = uStack_3ec8;
          auVar123._0_8_ = local_3ed0;
          auVar125 = ZEXT1664(auVar123);
          auVar118 = vpsraw_avx2(local_560,auVar123);
          lVar113 = (long)(local_35bc * local_35b8) * 2;
          local_248 = (undefined8 *)((long)local_3e80 + lVar113);
          local_41e0 = auVar118._0_8_;
          uStack_41d8 = auVar118._8_8_;
          uStack_41d0 = auVar118._16_8_;
          uStack_41c8 = auVar118._24_8_;
          local_280 = local_41e0;
          uStack_278 = uStack_41d8;
          uStack_270 = uStack_41d0;
          uStack_268 = uStack_41c8;
          *local_248 = local_41e0;
          *(undefined8 *)((long)local_3e80 + lVar113 + 8) = uStack_41d8;
          *(undefined8 *)((long)local_3e80 + lVar113 + 0x10) = uStack_41d0;
          *(undefined8 *)((long)local_3e80 + lVar113 + 0x18) = uStack_41c8;
          local_3e0 = auVar117;
          auStack_3d0 = auVar122;
        }
        local_2150 = (undefined8 *)(lVar110 + (local_35bc * local_2324 + local_4104));
        uVar116 = *local_2150;
        uVar120 = local_2150[1];
        uVar121 = 0;
        uVar124 = 0;
        data_03[1] = in_stack_ffffffffffffb520;
        data_03[0] = in_stack_ffffffffffffb518;
        data_03[2] = (longlong)in_stack_ffffffffffffb528;
        data_03[3] = (longlong)in_stack_ffffffffffffb530;
        local_21f0 = uVar116;
        uStack_21e8 = uVar120;
        convolve_lowbd_x_6tap(data_03,in_stack_ffffffffffffb510,in_stack_ffffffffffffb508);
        local_4220._8_8_ = uVar120;
        local_4220._0_8_ = uVar116;
        local_440 = local_3ec0;
        uStack_438 = uStack_3eb8;
        uStack_430 = uStack_3eb0;
        uStack_428 = uStack_3ea8;
        auVar91._16_8_ = uVar121;
        auVar91._0_16_ = local_4220;
        auVar91._24_8_ = uVar124;
        auVar90._8_8_ = uStack_3eb8;
        auVar90._0_8_ = local_3ec0;
        auVar90._16_8_ = uStack_3eb0;
        auVar90._24_8_ = uStack_3ea8;
        local_5a0 = vpaddw_avx2(auVar91,auVar90);
        local_5b0 = local_3ed0;
        uStack_5a8 = uStack_3ec8;
        auVar85._8_8_ = uStack_3ec8;
        auVar85._0_8_ = local_3ed0;
        auVar118 = vpsraw_avx2(local_5a0,auVar85);
        lVar113 = (long)(local_35bc * local_35b8) * 2;
        local_288 = (undefined8 *)((long)local_3e80 + lVar113);
        local_4220._0_8_ = auVar118._0_8_;
        local_4220._8_8_ = auVar118._8_8_;
        uStack_4210 = auVar118._16_8_;
        uStack_4208 = auVar118._24_8_;
        local_2c0 = local_4220._0_8_;
        uStack_2b8 = local_4220._8_8_;
        uStack_2b0 = uStack_4210;
        uStack_2a8 = uStack_4208;
        *local_288 = local_4220._0_8_;
        *(undefined8 *)((long)local_3e80 + lVar113 + 8) = local_4220._8_8_;
        *(undefined8 *)((long)local_3e80 + lVar113 + 0x10) = uStack_4210;
        *(undefined8 *)((long)local_3e80 + lVar113 + 0x18) = uStack_4208;
        local_420 = uVar116;
        uStack_418 = uVar120;
        uStack_410 = uVar121;
        uStack_408 = uVar124;
      }
      else {
        for (local_35bc = 0; local_35bc < iVar109 + -3; local_35bc = local_35bc + 2) {
          local_2158 = (undefined1 (*) [16])(lVar110 + (local_35bc * local_2324 + local_4104));
          local_2200 = *(undefined8 *)*local_2158;
          uStack_21f8 = *(undefined8 *)(*local_2158 + 8);
          local_2160 = (undefined1 (*) [16])
                       (lVar110 + (local_35bc * local_2324 + local_4104 + local_2324));
          auVar122 = ZEXT116(0) * *local_2160 + ZEXT116(1) * *local_2158;
          auVar123 = ZEXT116(0) * auVar125._0_16_ + ZEXT116(1) * *local_2160;
          data_04[1] = in_stack_ffffffffffffb520;
          data_04[0] = in_stack_ffffffffffffb518;
          data_04[2] = (longlong)in_stack_ffffffffffffb528;
          data_04[3] = (longlong)in_stack_ffffffffffffb530;
          convolve_lowbd_x(data_04,in_stack_ffffffffffffb510,in_stack_ffffffffffffb508);
          local_480 = local_3ec0;
          uStack_478 = uStack_3eb8;
          uStack_470 = uStack_3eb0;
          uStack_468 = uStack_3ea8;
          auVar119._16_8_ = auVar123._0_8_;
          auVar119._0_16_ = auVar122;
          auVar119._24_8_ = auVar123._8_8_;
          auVar118._8_8_ = uStack_3eb8;
          auVar118._0_8_ = local_3ec0;
          auVar118._16_8_ = uStack_3eb0;
          auVar118._24_8_ = uStack_3ea8;
          local_5e0 = vpaddw_avx2(auVar119,auVar118);
          local_5f0 = local_3ed0;
          uStack_5e8 = uStack_3ec8;
          auVar117._8_8_ = uStack_3ec8;
          auVar117._0_8_ = local_3ed0;
          auVar125 = ZEXT1664(auVar117);
          auVar118 = vpsraw_avx2(local_5e0,auVar117);
          lVar113 = (long)(local_35bc * local_35b8) * 2;
          local_2c8 = (undefined8 *)((long)local_3e80 + lVar113);
          local_4260 = auVar118._0_8_;
          uStack_4258 = auVar118._8_8_;
          uStack_4250 = auVar118._16_8_;
          uStack_4248 = auVar118._24_8_;
          local_300 = local_4260;
          uStack_2f8 = uStack_4258;
          uStack_2f0 = uStack_4250;
          uStack_2e8 = uStack_4248;
          *local_2c8 = local_4260;
          *(undefined8 *)((long)local_3e80 + lVar113 + 8) = uStack_4258;
          *(undefined8 *)((long)local_3e80 + lVar113 + 0x10) = uStack_4250;
          *(undefined8 *)((long)local_3e80 + lVar113 + 0x18) = uStack_4248;
          local_460 = auVar122;
          auStack_450 = auVar123;
        }
        local_2168 = (undefined8 *)(lVar110 + (local_35bc * local_2324 + local_4104));
        uVar116 = *local_2168;
        uVar120 = local_2168[1];
        uVar121 = 0;
        uVar124 = 0;
        data_05[1] = in_stack_ffffffffffffb520;
        data_05[0] = in_stack_ffffffffffffb518;
        data_05[2] = (longlong)in_stack_ffffffffffffb528;
        data_05[3] = (longlong)in_stack_ffffffffffffb530;
        local_2210 = uVar116;
        uStack_2208 = uVar120;
        convolve_lowbd_x(data_05,in_stack_ffffffffffffb510,in_stack_ffffffffffffb508);
        local_42a0._8_8_ = uVar120;
        local_42a0._0_8_ = uVar116;
        local_4c0 = local_3ec0;
        uStack_4b8 = uStack_3eb8;
        uStack_4b0 = uStack_3eb0;
        uStack_4a8 = uStack_3ea8;
        auVar89._16_8_ = uVar121;
        auVar89._0_16_ = local_42a0;
        auVar89._24_8_ = uVar124;
        auVar88._8_8_ = uStack_3eb8;
        auVar88._0_8_ = local_3ec0;
        auVar88._16_8_ = uStack_3eb0;
        auVar88._24_8_ = uStack_3ea8;
        local_620 = vpaddw_avx2(auVar89,auVar88);
        local_630 = local_3ed0;
        uStack_628 = uStack_3ec8;
        auVar122._8_8_ = uStack_3ec8;
        auVar122._0_8_ = local_3ed0;
        auVar118 = vpsraw_avx2(local_620,auVar122);
        lVar113 = (long)(local_35bc * local_35b8) * 2;
        local_308 = (undefined8 *)((long)local_3e80 + lVar113);
        local_42a0._0_8_ = auVar118._0_8_;
        local_42a0._8_8_ = auVar118._8_8_;
        uStack_4290 = auVar118._16_8_;
        uStack_4288 = auVar118._24_8_;
        local_340 = local_42a0._0_8_;
        uStack_338 = local_42a0._8_8_;
        uStack_330 = uStack_4290;
        uStack_328 = uStack_4288;
        *local_308 = local_42a0._0_8_;
        *(undefined8 *)((long)local_3e80 + lVar113 + 8) = local_42a0._8_8_;
        *(undefined8 *)((long)local_3e80 + lVar113 + 0x10) = uStack_4290;
        *(undefined8 *)((long)local_3e80 + lVar113 + 0x18) = uStack_4288;
        local_4a0 = uVar116;
        uStack_498 = uVar120;
        uStack_490 = uVar121;
        uStack_488 = uVar124;
      }
      if (iVar108 == 4) {
        local_848 = local_3e80;
        auVar99._8_8_ = local_3e80[1];
        auVar99._0_8_ = local_3e80[0];
        auVar99._16_8_ = local_3e80[2];
        auVar99._24_8_ = local_3e80[3];
        auVar98._8_8_ = local_3e80[1];
        auVar98._0_8_ = local_3e80[0];
        auVar98._16_8_ = local_3e80[2];
        auVar98._24_8_ = local_3e80[3];
        lVar113 = (long)local_35b8 * 2;
        local_850 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1dc0 = *local_850;
        uStack_1db8 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1db0 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1da8 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        lVar113 = (long)(local_35b8 * 2) * 2;
        local_858 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1de0 = *local_858;
        uStack_1dd8 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1dd0 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1dc8 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        lVar113 = (long)(local_35b8 * 3) * 2;
        local_860 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1e00 = *local_860;
        uStack_1df8 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1df0 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1de8 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        auVar19._8_8_ = uStack_1db8;
        auVar19._0_8_ = local_1dc0;
        auVar19._16_8_ = uStack_1db0;
        auVar19._24_8_ = uStack_1da8;
        vpunpcklwd_avx2(auVar98,auVar19);
        auVar18._8_8_ = uStack_1dd8;
        auVar18._0_8_ = local_1de0;
        auVar18._16_8_ = uStack_1dd0;
        auVar18._24_8_ = uStack_1dc8;
        auVar17._8_8_ = uStack_1df8;
        auVar17._0_8_ = local_1e00;
        auVar17._16_8_ = uStack_1df0;
        auVar17._24_8_ = uStack_1de8;
        vpunpcklwd_avx2(auVar18,auVar17);
        auVar39._8_8_ = uStack_1db8;
        auVar39._0_8_ = local_1dc0;
        auVar39._16_8_ = uStack_1db0;
        auVar39._24_8_ = uStack_1da8;
        vpunpckhwd_avx2(auVar99,auVar39);
        auVar38._8_8_ = uStack_1dd8;
        auVar38._0_8_ = local_1de0;
        auVar38._16_8_ = uStack_1dd0;
        auVar38._24_8_ = uStack_1dc8;
        auVar37._8_8_ = uStack_1df8;
        auVar37._0_8_ = local_1e00;
        auVar37._16_8_ = uStack_1df0;
        auVar37._24_8_ = uStack_1de8;
        auVar125 = ZEXT3264(auVar37);
        vpunpckhwd_avx2(auVar38,auVar37);
        local_1900 = local_1e00;
        uStack_18f8 = uStack_1df8;
        uStack_18f0 = uStack_1df0;
        uStack_18e8 = uStack_1de8;
        local_18e0 = local_1de0;
        uStack_18d8 = uStack_1dd8;
        uStack_18d0 = uStack_1dd0;
        uStack_18c8 = uStack_1dc8;
        local_18c0 = local_1dc0;
        uStack_18b8 = uStack_1db8;
        uStack_18b0 = uStack_1db0;
        uStack_18a8 = uStack_1da8;
        for (local_35bc = 0; local_35bc < local_233c; local_35bc = local_35bc + 2) {
          lVar113 = (long)(local_35bc * local_35b8) * 2 + -16000;
          local_868 = (undefined1 (*) [32])
                      ((long)local_3e80 + (long)(local_35b8 << 2) * 2 + lVar113 + 16000);
          local_1e20 = *(undefined8 *)*local_868;
          uStack_1e18 = *(undefined8 *)(*local_868 + 8);
          uStack_1e10 = *(undefined8 *)(*local_868 + 0x10);
          uStack_1e08 = *(undefined8 *)(*local_868 + 0x18);
          local_870 = (undefined1 (*) [32])
                      ((long)local_3e80 + (long)(local_35b8 * 5) * 2 + lVar113 + 16000);
          local_1e40 = *(undefined8 *)*local_870;
          uStack_1e38 = *(undefined8 *)(*local_870 + 8);
          uStack_1e30 = *(undefined8 *)(*local_870 + 0x10);
          uStack_1e28 = *(undefined8 *)(*local_870 + 0x18);
          vpunpcklwd_avx2(*local_868,*local_870);
          auVar118 = vpunpckhwd_avx2(*local_868,*local_870);
          puVar115 = local_40c0;
          local_1940 = local_1e40;
          uStack_1938 = uStack_1e38;
          uStack_1930 = uStack_1e30;
          uStack_1928 = uStack_1e28;
          local_1920 = local_1e20;
          uStack_1918 = uStack_1e18;
          uStack_1910 = uStack_1e10;
          uStack_1908 = uStack_1e08;
          convolve_4tap((__m256i *)local_4b00,
                        (__m256i *)CONCAT44(in_stack_ffffffffffffb4ec,in_stack_ffffffffffffb4e8));
          auVar119 = auVar118;
          convolve_4tap((__m256i *)local_4b00,
                        (__m256i *)CONCAT44(in_stack_ffffffffffffb4ec,in_stack_ffffffffffffb4e8));
          local_4460 = auVar118._0_8_;
          uStack_4458 = auVar118._8_8_;
          uStack_4450 = auVar118._16_8_;
          uStack_4448 = auVar118._24_8_;
          local_ea0 = local_4460;
          uStack_e98 = uStack_4458;
          uStack_e90 = uStack_4450;
          uStack_e88 = uStack_4448;
          local_ec0 = local_3f00;
          uStack_eb8 = uStack_3ef8;
          uStack_eb0 = uStack_3ef0;
          uStack_ea8 = uStack_3ee8;
          auVar78._8_8_ = uStack_3ef8;
          auVar78._0_8_ = local_3f00;
          auVar78._16_8_ = uStack_3ef0;
          auVar78._24_8_ = uStack_3ee8;
          local_1320 = vpaddd_avx2(auVar118,auVar78);
          local_1330 = local_3f10;
          uStack_1328 = uStack_3f08;
          auVar60._8_8_ = uStack_3f08;
          auVar60._0_8_ = local_3f10;
          auVar118 = vpsrad_avx2(local_1320,auVar60);
          local_4480 = auVar119._0_8_;
          uStack_4478 = auVar119._8_8_;
          uStack_4470 = auVar119._16_8_;
          uStack_4468 = auVar119._24_8_;
          local_ee0 = local_4480;
          uStack_ed8 = uStack_4478;
          uStack_ed0 = uStack_4470;
          uStack_ec8 = uStack_4468;
          local_f00 = local_3f00;
          uStack_ef8 = uStack_3ef8;
          uStack_ef0 = uStack_3ef0;
          uStack_ee8 = uStack_3ee8;
          auVar77._8_8_ = uStack_3ef8;
          auVar77._0_8_ = local_3f00;
          auVar77._16_8_ = uStack_3ef0;
          auVar77._24_8_ = uStack_3ee8;
          local_1360 = vpaddd_avx2(auVar119,auVar77);
          local_1370 = local_3f10;
          uStack_1368 = uStack_3f08;
          auVar59._8_8_ = uStack_3f08;
          auVar59._0_8_ = local_3f10;
          auVar119 = vpsrad_avx2(local_1360,auVar59);
          local_4460 = auVar118._0_8_;
          uStack_4458 = auVar118._8_8_;
          uStack_4450 = auVar118._16_8_;
          uStack_4448 = auVar118._24_8_;
          local_f20 = local_4460;
          uStack_f18 = uStack_4458;
          uStack_f10 = uStack_4450;
          uStack_f08 = uStack_4448;
          local_f40 = local_3f40;
          uStack_f38 = uStack_3f38;
          uStack_f30 = uStack_3f30;
          uStack_f28 = uStack_3f28;
          auVar76._8_8_ = uStack_3f38;
          auVar76._0_8_ = local_3f40;
          auVar76._16_8_ = uStack_3f30;
          auVar76._24_8_ = uStack_3f28;
          local_13a0 = vpaddd_avx2(auVar118,auVar76);
          local_13b0 = local_3f50;
          uStack_13a8 = uStack_3f48;
          auVar58._8_8_ = uStack_3f48;
          auVar58._0_8_ = local_3f50;
          auVar118 = vpsrad_avx2(local_13a0,auVar58);
          local_4480 = auVar119._0_8_;
          uStack_4478 = auVar119._8_8_;
          uStack_4470 = auVar119._16_8_;
          uStack_4468 = auVar119._24_8_;
          local_f60 = local_4480;
          uStack_f58 = uStack_4478;
          uStack_f50 = uStack_4470;
          uStack_f48 = uStack_4468;
          local_f80 = local_3f40;
          uStack_f78 = uStack_3f38;
          uStack_f70 = uStack_3f30;
          uStack_f68 = uStack_3f28;
          auVar75._8_8_ = uStack_3f38;
          auVar75._0_8_ = local_3f40;
          auVar75._16_8_ = uStack_3f30;
          auVar75._24_8_ = uStack_3f28;
          local_13e0 = vpaddd_avx2(auVar119,auVar75);
          local_13f0 = local_3f50;
          uStack_13e8 = uStack_3f48;
          auVar57._8_8_ = uStack_3f48;
          auVar57._0_8_ = local_3f50;
          auVar119 = vpsrad_avx2(local_13e0,auVar57);
          local_44a0 = auVar118._0_8_;
          uStack_4498 = auVar118._8_8_;
          uStack_4490 = auVar118._16_8_;
          uStack_4488 = auVar118._24_8_;
          local_44c0 = auVar119._0_8_;
          uStack_44b8 = auVar119._8_8_;
          uStack_44b0 = auVar119._16_8_;
          uStack_44a8 = auVar119._24_8_;
          local_c60 = local_44a0;
          uStack_c58 = uStack_4498;
          uStack_c50 = uStack_4490;
          uStack_c48 = uStack_4488;
          local_c80 = local_44c0;
          uStack_c78 = uStack_44b8;
          uStack_c70 = uStack_44b0;
          uStack_c68 = uStack_44a8;
          auVar118 = vpackssdw_avx2(auVar118,auVar119);
          local_44e0 = auVar118._0_8_;
          uStack_44d8 = auVar118._8_8_;
          uStack_44d0 = auVar118._16_8_;
          uStack_44c8 = auVar118._24_8_;
          local_740 = local_44e0;
          uStack_738 = uStack_44d8;
          uStack_730 = uStack_44d0;
          uStack_728 = uStack_44c8;
          local_760 = local_44e0;
          uStack_758 = uStack_44d8;
          uStack_750 = uStack_44d0;
          uStack_748 = uStack_44c8;
          auVar125 = ZEXT3264(auVar118);
          auVar119 = vpackuswb_avx2(auVar118,auVar118);
          local_4500 = auVar119._0_8_;
          uStack_44f8 = auVar119._8_8_;
          uStack_44f0 = auVar119._16_8_;
          uStack_44e8 = auVar119._24_8_;
          local_6a0 = local_4500;
          uStack_698 = uStack_44f8;
          uStack_690 = uStack_44f0;
          uStack_688 = uStack_44e8;
          puVar111 = (undefined8 *)(local_2330 + (local_35bc * local_2334 + local_4104));
          puVar112 = (undefined8 *)
                     (local_2330 + (local_35bc * local_2334 + local_4104 + local_2334));
          if (local_2338 - local_4104 < 5) {
            if (local_2338 == 4) {
              auVar125 = ZEXT1664(auVar118._0_16_);
              v_01[1] = extraout_RDX_01;
              v_01[0] = (longlong)puVar115;
              xx_storel_32(puVar111,v_01);
              v_02[1] = extraout_RDX_02;
              v_02[0] = (longlong)puVar115;
              xx_storel_32(puVar112,v_02);
            }
            else {
              local_990 = local_4500;
              uStack_988 = uStack_44f8;
              local_9a0 = local_4500;
              uStack_998 = uStack_44f8;
              *(short *)puVar111 = auVar119._0_2_;
              local_9b0 = uStack_44f0;
              uStack_9a8 = uStack_44e8;
              local_9c0 = uStack_44f0;
              uStack_9b8 = uStack_44e8;
              *(short *)puVar112 = auVar119._16_2_;
            }
          }
          else {
            local_ae0 = local_4500;
            uStack_ad8 = uStack_44f8;
            *puVar111 = local_4500;
            local_b00 = uStack_44f0;
            uStack_af8 = uStack_44e8;
            *puVar112 = uStack_44f0;
            local_ae8 = puVar112;
            local_ac8 = puVar111;
          }
        }
      }
      else if (iVar108 == 6) {
        local_878 = local_3e80;
        auVar101._8_8_ = local_3e80[1];
        auVar101._0_8_ = local_3e80[0];
        auVar101._16_8_ = local_3e80[2];
        auVar101._24_8_ = local_3e80[3];
        auVar100._8_8_ = local_3e80[1];
        auVar100._0_8_ = local_3e80[0];
        auVar100._16_8_ = local_3e80[2];
        auVar100._24_8_ = local_3e80[3];
        lVar113 = (long)local_35b8 * 2;
        local_880 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1e80 = *local_880;
        uStack_1e78 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1e70 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1e68 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        lVar113 = (long)(local_35b8 * 2) * 2;
        local_888 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1ea0 = *local_888;
        uStack_1e98 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1e90 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1e88 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        lVar113 = (long)(local_35b8 * 3) * 2;
        local_890 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1ec0 = *local_890;
        uStack_1eb8 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1eb0 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1ea8 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        auVar16._8_8_ = uStack_1e78;
        auVar16._0_8_ = local_1e80;
        auVar16._16_8_ = uStack_1e70;
        auVar16._24_8_ = uStack_1e68;
        vpunpcklwd_avx2(auVar100,auVar16);
        auVar15._8_8_ = uStack_1e98;
        auVar15._0_8_ = local_1ea0;
        auVar15._16_8_ = uStack_1e90;
        auVar15._24_8_ = uStack_1e88;
        auVar14._8_8_ = uStack_1eb8;
        auVar14._0_8_ = local_1ec0;
        auVar14._16_8_ = uStack_1eb0;
        auVar14._24_8_ = uStack_1ea8;
        vpunpcklwd_avx2(auVar15,auVar14);
        auVar36._8_8_ = uStack_1e78;
        auVar36._0_8_ = local_1e80;
        auVar36._16_8_ = uStack_1e70;
        auVar36._24_8_ = uStack_1e68;
        vpunpckhwd_avx2(auVar101,auVar36);
        auVar35._8_8_ = uStack_1e98;
        auVar35._0_8_ = local_1ea0;
        auVar35._16_8_ = uStack_1e90;
        auVar35._24_8_ = uStack_1e88;
        auVar34._8_8_ = uStack_1eb8;
        auVar34._0_8_ = local_1ec0;
        auVar34._16_8_ = uStack_1eb0;
        auVar34._24_8_ = uStack_1ea8;
        auVar125 = ZEXT3264(auVar34);
        vpunpckhwd_avx2(auVar35,auVar34);
        local_19c0 = local_1ec0;
        uStack_19b8 = uStack_1eb8;
        uStack_19b0 = uStack_1eb0;
        uStack_19a8 = uStack_1ea8;
        local_19a0 = local_1ea0;
        uStack_1998 = uStack_1e98;
        uStack_1990 = uStack_1e90;
        uStack_1988 = uStack_1e88;
        local_1980 = local_1e80;
        uStack_1978 = uStack_1e78;
        uStack_1970 = uStack_1e70;
        uStack_1968 = uStack_1e68;
        for (local_35bc = 0; local_35bc < local_233c; local_35bc = local_35bc + 2) {
          lVar113 = (long)(local_35bc * local_35b8) * 2 + -16000;
          local_898 = (undefined1 (*) [32])
                      ((long)local_3e80 + (long)(local_35b8 << 2) * 2 + lVar113 + 16000);
          local_1ee0 = *(undefined8 *)*local_898;
          uStack_1ed8 = *(undefined8 *)(*local_898 + 8);
          uStack_1ed0 = *(undefined8 *)(*local_898 + 0x10);
          uStack_1ec8 = *(undefined8 *)(*local_898 + 0x18);
          local_8a0 = (undefined1 (*) [32])
                      ((long)local_3e80 + (long)(local_35b8 * 5) * 2 + lVar113 + 16000);
          local_1f00 = *(undefined8 *)*local_8a0;
          uStack_1ef8 = *(undefined8 *)(*local_8a0 + 8);
          uStack_1ef0 = *(undefined8 *)(*local_8a0 + 0x10);
          uStack_1ee8 = *(undefined8 *)(*local_8a0 + 0x18);
          vpunpcklwd_avx2(*local_898,*local_8a0);
          auVar118 = vpunpckhwd_avx2(*local_898,*local_8a0);
          puVar115 = local_40e0;
          local_1a00 = local_1f00;
          uStack_19f8 = uStack_1ef8;
          uStack_19f0 = uStack_1ef0;
          uStack_19e8 = uStack_1ee8;
          local_19e0 = local_1ee0;
          uStack_19d8 = uStack_1ed8;
          uStack_19d0 = uStack_1ed0;
          uStack_19c8 = uStack_1ec8;
          convolve_6tap(in_stack_ffffffffffffb510,in_stack_ffffffffffffb508);
          auVar119 = auVar118;
          convolve_6tap(in_stack_ffffffffffffb510,in_stack_ffffffffffffb508);
          local_4740 = auVar118._0_8_;
          uStack_4738 = auVar118._8_8_;
          uStack_4730 = auVar118._16_8_;
          uStack_4728 = auVar118._24_8_;
          local_fa0 = local_4740;
          uStack_f98 = uStack_4738;
          uStack_f90 = uStack_4730;
          uStack_f88 = uStack_4728;
          local_fc0 = local_3f00;
          uStack_fb8 = uStack_3ef8;
          uStack_fb0 = uStack_3ef0;
          uStack_fa8 = uStack_3ee8;
          auVar74._8_8_ = uStack_3ef8;
          auVar74._0_8_ = local_3f00;
          auVar74._16_8_ = uStack_3ef0;
          auVar74._24_8_ = uStack_3ee8;
          local_1420 = vpaddd_avx2(auVar118,auVar74);
          local_1430 = local_3f10;
          uStack_1428 = uStack_3f08;
          auVar56._8_8_ = uStack_3f08;
          auVar56._0_8_ = local_3f10;
          auVar118 = vpsrad_avx2(local_1420,auVar56);
          local_4760 = auVar119._0_8_;
          uStack_4758 = auVar119._8_8_;
          uStack_4750 = auVar119._16_8_;
          uStack_4748 = auVar119._24_8_;
          local_fe0 = local_4760;
          uStack_fd8 = uStack_4758;
          uStack_fd0 = uStack_4750;
          uStack_fc8 = uStack_4748;
          local_1000 = local_3f00;
          uStack_ff8 = uStack_3ef8;
          uStack_ff0 = uStack_3ef0;
          uStack_fe8 = uStack_3ee8;
          auVar73._8_8_ = uStack_3ef8;
          auVar73._0_8_ = local_3f00;
          auVar73._16_8_ = uStack_3ef0;
          auVar73._24_8_ = uStack_3ee8;
          local_1460 = vpaddd_avx2(auVar119,auVar73);
          local_1470 = local_3f10;
          uStack_1468 = uStack_3f08;
          auVar55._8_8_ = uStack_3f08;
          auVar55._0_8_ = local_3f10;
          auVar119 = vpsrad_avx2(local_1460,auVar55);
          local_4740 = auVar118._0_8_;
          uStack_4738 = auVar118._8_8_;
          uStack_4730 = auVar118._16_8_;
          uStack_4728 = auVar118._24_8_;
          local_1020 = local_4740;
          uStack_1018 = uStack_4738;
          uStack_1010 = uStack_4730;
          uStack_1008 = uStack_4728;
          local_1040 = local_3f40;
          uStack_1038 = uStack_3f38;
          uStack_1030 = uStack_3f30;
          uStack_1028 = uStack_3f28;
          auVar72._8_8_ = uStack_3f38;
          auVar72._0_8_ = local_3f40;
          auVar72._16_8_ = uStack_3f30;
          auVar72._24_8_ = uStack_3f28;
          local_14a0 = vpaddd_avx2(auVar118,auVar72);
          local_14b0 = local_3f50;
          uStack_14a8 = uStack_3f48;
          auVar54._8_8_ = uStack_3f48;
          auVar54._0_8_ = local_3f50;
          auVar118 = vpsrad_avx2(local_14a0,auVar54);
          local_4760 = auVar119._0_8_;
          uStack_4758 = auVar119._8_8_;
          uStack_4750 = auVar119._16_8_;
          uStack_4748 = auVar119._24_8_;
          local_1060 = local_4760;
          uStack_1058 = uStack_4758;
          uStack_1050 = uStack_4750;
          uStack_1048 = uStack_4748;
          local_1080 = local_3f40;
          uStack_1078 = uStack_3f38;
          uStack_1070 = uStack_3f30;
          uStack_1068 = uStack_3f28;
          auVar71._8_8_ = uStack_3f38;
          auVar71._0_8_ = local_3f40;
          auVar71._16_8_ = uStack_3f30;
          auVar71._24_8_ = uStack_3f28;
          local_14e0 = vpaddd_avx2(auVar119,auVar71);
          local_14f0 = local_3f50;
          uStack_14e8 = uStack_3f48;
          auVar53._8_8_ = uStack_3f48;
          auVar53._0_8_ = local_3f50;
          auVar119 = vpsrad_avx2(local_14e0,auVar53);
          local_4780 = auVar118._0_8_;
          uStack_4778 = auVar118._8_8_;
          uStack_4770 = auVar118._16_8_;
          uStack_4768 = auVar118._24_8_;
          local_47a0 = auVar119._0_8_;
          uStack_4798 = auVar119._8_8_;
          uStack_4790 = auVar119._16_8_;
          uStack_4788 = auVar119._24_8_;
          local_ca0 = local_4780;
          uStack_c98 = uStack_4778;
          uStack_c90 = uStack_4770;
          uStack_c88 = uStack_4768;
          local_cc0 = local_47a0;
          uStack_cb8 = uStack_4798;
          uStack_cb0 = uStack_4790;
          uStack_ca8 = uStack_4788;
          auVar118 = vpackssdw_avx2(auVar118,auVar119);
          local_47c0 = auVar118._0_8_;
          uStack_47b8 = auVar118._8_8_;
          uStack_47b0 = auVar118._16_8_;
          uStack_47a8 = auVar118._24_8_;
          local_780 = local_47c0;
          uStack_778 = uStack_47b8;
          uStack_770 = uStack_47b0;
          uStack_768 = uStack_47a8;
          local_7a0 = local_47c0;
          uStack_798 = uStack_47b8;
          uStack_790 = uStack_47b0;
          uStack_788 = uStack_47a8;
          auVar125 = ZEXT3264(auVar118);
          auVar119 = vpackuswb_avx2(auVar118,auVar118);
          local_47e0 = auVar119._0_8_;
          uStack_47d8 = auVar119._8_8_;
          uStack_47d0 = auVar119._16_8_;
          uStack_47c8 = auVar119._24_8_;
          local_6c0 = local_47e0;
          uStack_6b8 = uStack_47d8;
          uStack_6b0 = uStack_47d0;
          uStack_6a8 = uStack_47c8;
          puVar111 = (undefined8 *)(local_2330 + (local_35bc * local_2334 + local_4104));
          puVar112 = (undefined8 *)
                     (local_2330 + (local_35bc * local_2334 + local_4104 + local_2334));
          if (local_2338 - local_4104 < 5) {
            if (local_2338 == 4) {
              auVar125 = ZEXT1664(auVar118._0_16_);
              v_03[1] = extraout_RDX_03;
              v_03[0] = (longlong)puVar115;
              xx_storel_32(puVar111,v_03);
              v_04[1] = extraout_RDX_04;
              v_04[0] = (longlong)puVar115;
              xx_storel_32(puVar112,v_04);
            }
            else {
              local_9d0 = local_47e0;
              uStack_9c8 = uStack_47d8;
              local_9e0 = local_47e0;
              uStack_9d8 = uStack_47d8;
              *(short *)puVar111 = auVar119._0_2_;
              local_9f0 = uStack_47d0;
              uStack_9e8 = uStack_47c8;
              local_a00 = uStack_47d0;
              uStack_9f8 = uStack_47c8;
              *(short *)puVar112 = auVar119._16_2_;
            }
          }
          else {
            local_b20 = local_47e0;
            uStack_b18 = uStack_47d8;
            *puVar111 = local_47e0;
            local_b40 = uStack_47d0;
            uStack_b38 = uStack_47c8;
            *puVar112 = uStack_47d0;
            local_b28 = puVar112;
            local_b08 = puVar111;
          }
        }
      }
      else {
        local_8a8 = local_3e80;
        auVar103._8_8_ = local_3e80[1];
        auVar103._0_8_ = local_3e80[0];
        auVar103._16_8_ = local_3e80[2];
        auVar103._24_8_ = local_3e80[3];
        auVar102._8_8_ = local_3e80[1];
        auVar102._0_8_ = local_3e80[0];
        auVar102._16_8_ = local_3e80[2];
        auVar102._24_8_ = local_3e80[3];
        lVar113 = (long)local_35b8 * 2;
        local_8b0 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1f40 = *local_8b0;
        uStack_1f38 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1f30 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1f28 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        lVar113 = (long)(local_35b8 * 2) * 2;
        local_8b8 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1f60 = *local_8b8;
        uStack_1f58 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1f50 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1f48 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        lVar113 = (long)(local_35b8 * 3) * 2;
        local_8c0 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1f80 = *local_8c0;
        uStack_1f78 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1f70 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1f68 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        lVar113 = (long)(local_35b8 << 2) * 2;
        local_8c8 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1fa0 = *local_8c8;
        uStack_1f98 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1f90 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1f88 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        lVar113 = (long)(local_35b8 * 5) * 2;
        local_8d0 = (undefined8 *)((long)local_3e80 + lVar113);
        local_1fc0 = *local_8d0;
        uStack_1fb8 = *(undefined8 *)((long)local_3e80 + lVar113 + 8);
        uStack_1fb0 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x10);
        uStack_1fa8 = *(undefined8 *)((long)local_3e80 + lVar113 + 0x18);
        auVar13._8_8_ = uStack_1f38;
        auVar13._0_8_ = local_1f40;
        auVar13._16_8_ = uStack_1f30;
        auVar13._24_8_ = uStack_1f28;
        vpunpcklwd_avx2(auVar102,auVar13);
        auVar12._8_8_ = uStack_1f58;
        auVar12._0_8_ = local_1f60;
        auVar12._16_8_ = uStack_1f50;
        auVar12._24_8_ = uStack_1f48;
        auVar11._8_8_ = uStack_1f78;
        auVar11._0_8_ = local_1f80;
        auVar11._16_8_ = uStack_1f70;
        auVar11._24_8_ = uStack_1f68;
        vpunpcklwd_avx2(auVar12,auVar11);
        auVar10._8_8_ = uStack_1f98;
        auVar10._0_8_ = local_1fa0;
        auVar10._16_8_ = uStack_1f90;
        auVar10._24_8_ = uStack_1f88;
        auVar9._8_8_ = uStack_1fb8;
        auVar9._0_8_ = local_1fc0;
        auVar9._16_8_ = uStack_1fb0;
        auVar9._24_8_ = uStack_1fa8;
        vpunpcklwd_avx2(auVar10,auVar9);
        auVar33._8_8_ = uStack_1f38;
        auVar33._0_8_ = local_1f40;
        auVar33._16_8_ = uStack_1f30;
        auVar33._24_8_ = uStack_1f28;
        vpunpckhwd_avx2(auVar103,auVar33);
        auVar32._8_8_ = uStack_1f58;
        auVar32._0_8_ = local_1f60;
        auVar32._16_8_ = uStack_1f50;
        auVar32._24_8_ = uStack_1f48;
        auVar31._8_8_ = uStack_1f78;
        auVar31._0_8_ = local_1f80;
        auVar31._16_8_ = uStack_1f70;
        auVar31._24_8_ = uStack_1f68;
        vpunpckhwd_avx2(auVar32,auVar31);
        auVar30._8_8_ = uStack_1f98;
        auVar30._0_8_ = local_1fa0;
        auVar30._16_8_ = uStack_1f90;
        auVar30._24_8_ = uStack_1f88;
        auVar29._8_8_ = uStack_1fb8;
        auVar29._0_8_ = local_1fc0;
        auVar29._16_8_ = uStack_1fb0;
        auVar29._24_8_ = uStack_1fa8;
        auVar125 = ZEXT3264(auVar29);
        vpunpckhwd_avx2(auVar30,auVar29);
        local_1ac0 = local_1fc0;
        uStack_1ab8 = uStack_1fb8;
        uStack_1ab0 = uStack_1fb0;
        uStack_1aa8 = uStack_1fa8;
        local_1aa0 = local_1fa0;
        uStack_1a98 = uStack_1f98;
        uStack_1a90 = uStack_1f90;
        uStack_1a88 = uStack_1f88;
        local_1a80 = local_1f80;
        uStack_1a78 = uStack_1f78;
        uStack_1a70 = uStack_1f70;
        uStack_1a68 = uStack_1f68;
        local_1a60 = local_1f60;
        uStack_1a58 = uStack_1f58;
        uStack_1a50 = uStack_1f50;
        uStack_1a48 = uStack_1f48;
        local_1a40 = local_1f40;
        uStack_1a38 = uStack_1f38;
        uStack_1a30 = uStack_1f30;
        uStack_1a28 = uStack_1f28;
        for (local_35bc = 0; local_35bc < local_233c; local_35bc = local_35bc + 2) {
          lVar113 = (long)(local_35bc * local_35b8) * 2 + -16000;
          local_8d8 = (undefined1 (*) [32])
                      ((long)local_3e80 + (long)(local_35b8 * 6) * 2 + lVar113 + 16000);
          local_1fe0 = *(undefined8 *)*local_8d8;
          uStack_1fd8 = *(undefined8 *)(*local_8d8 + 8);
          uStack_1fd0 = *(undefined8 *)(*local_8d8 + 0x10);
          uStack_1fc8 = *(undefined8 *)(*local_8d8 + 0x18);
          local_8e0 = (undefined1 (*) [32])
                      ((long)local_3e80 + (long)(local_35b8 * 7) * 2 + lVar113 + 16000);
          local_2000 = *(undefined8 *)*local_8e0;
          uStack_1ff8 = *(undefined8 *)(*local_8e0 + 8);
          uStack_1ff0 = *(undefined8 *)(*local_8e0 + 0x10);
          uStack_1fe8 = *(undefined8 *)(*local_8e0 + 0x18);
          vpunpcklwd_avx2(*local_8d8,*local_8e0);
          auVar118 = vpunpckhwd_avx2(*local_8d8,*local_8e0);
          puVar115 = local_40e0;
          local_1b00 = local_2000;
          uStack_1af8 = uStack_1ff8;
          uStack_1af0 = uStack_1ff0;
          uStack_1ae8 = uStack_1fe8;
          local_1ae0 = local_1fe0;
          uStack_1ad8 = uStack_1fd8;
          uStack_1ad0 = uStack_1fd0;
          uStack_1ac8 = uStack_1fc8;
          convolve(in_stack_ffffffffffffb530,in_stack_ffffffffffffb528);
          auVar119 = auVar118;
          convolve(in_stack_ffffffffffffb530,in_stack_ffffffffffffb528);
          local_4a60 = auVar118._0_8_;
          uStack_4a58 = auVar118._8_8_;
          uStack_4a50 = auVar118._16_8_;
          uStack_4a48 = auVar118._24_8_;
          local_10a0 = local_4a60;
          uStack_1098 = uStack_4a58;
          uStack_1090 = uStack_4a50;
          uStack_1088 = uStack_4a48;
          local_10c0 = local_3f00;
          uStack_10b8 = uStack_3ef8;
          uStack_10b0 = uStack_3ef0;
          uStack_10a8 = uStack_3ee8;
          auVar70._8_8_ = uStack_3ef8;
          auVar70._0_8_ = local_3f00;
          auVar70._16_8_ = uStack_3ef0;
          auVar70._24_8_ = uStack_3ee8;
          local_1520 = vpaddd_avx2(auVar118,auVar70);
          local_1530 = local_3f10;
          uStack_1528 = uStack_3f08;
          auVar52._8_8_ = uStack_3f08;
          auVar52._0_8_ = local_3f10;
          auVar118 = vpsrad_avx2(local_1520,auVar52);
          local_4a80 = auVar119._0_8_;
          coeffs = auVar119._8_8_;
          uStack_10d8 = coeffs;
          s_00 = auVar119._16_8_;
          uStack_10d0 = s_00;
          uStack_4a68 = auVar119._24_8_;
          local_10e0 = local_4a80;
          uStack_10c8 = uStack_4a68;
          local_1100 = local_3f00;
          uStack_10f8 = uStack_3ef8;
          uStack_10f0 = uStack_3ef0;
          uStack_10e8 = uStack_3ee8;
          auVar69._8_8_ = uStack_3ef8;
          auVar69._0_8_ = local_3f00;
          auVar69._16_8_ = uStack_3ef0;
          auVar69._24_8_ = uStack_3ee8;
          local_1560 = vpaddd_avx2(auVar119,auVar69);
          local_1570 = local_3f10;
          uStack_1568 = uStack_3f08;
          auVar51._8_8_ = uStack_3f08;
          auVar51._0_8_ = local_3f10;
          auVar119 = vpsrad_avx2(local_1560,auVar51);
          local_4a60 = auVar118._0_8_;
          uStack_4a58 = auVar118._8_8_;
          uStack_4a50 = auVar118._16_8_;
          uStack_4a48 = auVar118._24_8_;
          local_1120 = local_4a60;
          uStack_1118 = uStack_4a58;
          uStack_1110 = uStack_4a50;
          uStack_1108 = uStack_4a48;
          local_1140 = local_3f40;
          uStack_1138 = uStack_3f38;
          uStack_1130 = uStack_3f30;
          uStack_1128 = uStack_3f28;
          auVar68._8_8_ = uStack_3f38;
          auVar68._0_8_ = local_3f40;
          auVar68._16_8_ = uStack_3f30;
          auVar68._24_8_ = uStack_3f28;
          local_15a0 = vpaddd_avx2(auVar118,auVar68);
          local_15b0 = local_3f50;
          uStack_15a8 = uStack_3f48;
          auVar50._8_8_ = uStack_3f48;
          auVar50._0_8_ = local_3f50;
          auVar118 = vpsrad_avx2(local_15a0,auVar50);
          local_4a80 = auVar119._0_8_;
          coeffs = auVar119._8_8_;
          s_00 = auVar119._16_8_;
          uStack_4a68 = auVar119._24_8_;
          local_1160 = local_4a80;
          uStack_1148 = uStack_4a68;
          local_1180 = local_3f40;
          uStack_1178 = uStack_3f38;
          uStack_1170 = uStack_3f30;
          uStack_1168 = uStack_3f28;
          auVar67._8_8_ = uStack_3f38;
          auVar67._0_8_ = local_3f40;
          auVar67._16_8_ = uStack_3f30;
          auVar67._24_8_ = uStack_3f28;
          local_15e0 = vpaddd_avx2(auVar119,auVar67);
          local_15f0 = local_3f50;
          uStack_15e8 = uStack_3f48;
          auVar49._8_8_ = uStack_3f48;
          auVar49._0_8_ = local_3f50;
          auVar119 = vpsrad_avx2(local_15e0,auVar49);
          local_4aa0 = auVar118._0_8_;
          uStack_4a98 = auVar118._8_8_;
          uStack_4a90 = auVar118._16_8_;
          uStack_4a88 = auVar118._24_8_;
          local_4ac0 = auVar119._0_8_;
          uStack_4ab8 = auVar119._8_8_;
          uStack_4ab0 = auVar119._16_8_;
          uStack_4aa8 = auVar119._24_8_;
          local_ce0 = local_4aa0;
          uStack_cd8 = uStack_4a98;
          uStack_cd0 = uStack_4a90;
          uStack_cc8 = uStack_4a88;
          local_d00 = local_4ac0;
          uStack_cf8 = uStack_4ab8;
          uStack_cf0 = uStack_4ab0;
          uStack_ce8 = uStack_4aa8;
          auVar118 = vpackssdw_avx2(auVar118,auVar119);
          in_stack_ffffffffffffb520 = auVar118._0_8_;
          in_stack_ffffffffffffb528 = auVar118._8_8_;
          in_stack_ffffffffffffb530 = auVar118._16_8_;
          uStack_4ac8 = auVar118._24_8_;
          uStack_7a8 = uStack_4ac8;
          uStack_7c8 = uStack_4ac8;
          auVar125 = ZEXT3264(auVar118);
          auVar119 = vpackuswb_avx2(auVar118,auVar118);
          local_4b00 = auVar119._0_8_;
          in_stack_ffffffffffffb508 = auVar119._8_8_;
          in_stack_ffffffffffffb4e0 = auVar119._16_8_;
          in_stack_ffffffffffffb518 = auVar119._24_8_;
          local_6e0 = local_4b00;
          in_stack_ffffffffffffb4e8 = auVar119._24_4_;
          in_stack_ffffffffffffb4ec = auVar119._28_4_;
          in_stack_ffffffffffffb4d8 =
               (InterpFilterParams *)(local_2330 + (local_35bc * local_2334 + local_4104));
          in_stack_ffffffffffffb4d0 =
               (__m256i *)(local_2330 + (local_35bc * local_2334 + local_4104 + local_2334));
          in_stack_ffffffffffffb510 = in_stack_ffffffffffffb4e0;
          uStack_1158 = coeffs;
          uStack_1150 = s_00;
          local_7e0 = in_stack_ffffffffffffb520;
          palStack_7d8 = in_stack_ffffffffffffb528;
          palStack_7d0 = in_stack_ffffffffffffb530;
          local_7c0 = in_stack_ffffffffffffb520;
          palStack_7b8 = in_stack_ffffffffffffb528;
          palStack_7b0 = in_stack_ffffffffffffb530;
          palStack_6d8 = in_stack_ffffffffffffb508;
          palStack_6d0 = in_stack_ffffffffffffb4e0;
          uStack_6c8 = in_stack_ffffffffffffb518;
          if (local_2338 - local_4104 < 5) {
            if (local_2338 == 4) {
              auVar125 = ZEXT1664(auVar118._0_16_);
              v_05[1] = extraout_RDX_05;
              v_05[0] = (longlong)puVar115;
              xx_storel_32(in_stack_ffffffffffffb4d8,v_05);
              v_06[1] = extraout_RDX_06;
              v_06[0] = (longlong)puVar115;
              xx_storel_32(in_stack_ffffffffffffb4d0,v_06);
            }
            else {
              local_a10 = local_4b00;
              local_a20 = local_4b00;
              *(short *)&in_stack_ffffffffffffb4d8->filter_ptr = auVar119._0_2_;
              *(short *)*in_stack_ffffffffffffb4d0 = auVar119._16_2_;
              local_a40 = in_stack_ffffffffffffb4e0;
              uStack_a38 = in_stack_ffffffffffffb518;
              local_a30 = in_stack_ffffffffffffb4e0;
              uStack_a28 = in_stack_ffffffffffffb518;
              palStack_a18 = in_stack_ffffffffffffb508;
              palStack_a08 = in_stack_ffffffffffffb508;
            }
          }
          else {
            local_b60 = local_4b00;
            in_stack_ffffffffffffb4d8->filter_ptr = (int16_t *)local_4b00;
            (*in_stack_ffffffffffffb4d0)[0] = (longlong)in_stack_ffffffffffffb4e0;
            local_b80 = in_stack_ffffffffffffb4e0;
            uStack_b78 = in_stack_ffffffffffffb518;
            local_b68 = in_stack_ffffffffffffb4d0;
            palStack_b58 = in_stack_ffffffffffffb508;
            local_b48 = in_stack_ffffffffffffb4d8;
          }
        }
      }
    }
  }
  else {
    local_2340 = 8;
    local_2344 = 8;
    local_2c24 = 0xe - (*(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) +
                       *(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18));
    local_2c28 = 0x16 - *(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14);
    local_2304 = ((1 << (*(byte *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) & 0x1f)) >> 1) +
                 0x4000;
    auVar117 = vpinsrd_avx(ZEXT416(local_2304),local_2304,1);
    auVar117 = vpinsrd_avx(auVar117,local_2304,2);
    local_1c0 = vpinsrd_avx(auVar117,local_2304,3);
    auVar117 = vpinsrd_avx(ZEXT416(local_2304),local_2304,1);
    auVar117 = vpinsrd_avx(auVar117,local_2304,2);
    auStack_1b0 = vpinsrd_avx(auVar117,local_2304,3);
    local_2c60 = local_1c0._0_8_;
    uStack_2c58 = local_1c0._8_8_;
    uStack_2c50 = auStack_1b0._0_8_;
    uStack_2c48 = auStack_1b0._8_8_;
    local_2244 = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14);
    local_2260._4_4_ = 0;
    local_2260._0_4_ = local_2244;
    local_2c70 = local_2260._0_8_;
    uStack_2c68 = 0;
    uVar106 = (1 << ((byte)local_2c28 & 0x1f)) +
              ((1 << (*(byte *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18) & 0x1f)) >> 1);
    auVar117 = vpinsrd_avx(ZEXT416(uVar106),uVar106,1);
    auVar117 = vpinsrd_avx(auVar117,uVar106,2);
    local_180 = vpinsrd_avx(auVar117,uVar106,3);
    auVar117 = vpinsrd_avx(ZEXT416(uVar106),uVar106,1);
    auVar117 = vpinsrd_avx(auVar117,uVar106,2);
    auStack_170 = vpinsrd_avx(auVar117,uVar106,3);
    local_2ca0 = local_180._0_8_;
    uStack_2c98 = local_180._8_8_;
    uStack_2c90 = auStack_170._0_8_;
    uStack_2c88 = auStack_170._8_8_;
    local_2264 = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18);
    local_2280._4_4_ = 0;
    local_2280._0_4_ = local_2264;
    local_2cb0 = local_2280._0_8_;
    uStack_2ca8 = 0;
    iVar114 = 1 << ((byte)local_2c28 -
                    (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18) & 0x1f);
    uVar107 = (((1 << ((byte)local_2c24 & 0x1f)) >> 1) - iVar114) - (iVar114 >> 1);
    auVar117 = vpinsrd_avx(ZEXT416(uVar107),uVar107,1);
    auVar117 = vpinsrd_avx(auVar117,uVar107,2);
    local_140 = vpinsrd_avx(auVar117,uVar107,3);
    auVar117 = vpinsrd_avx(ZEXT416(uVar107),uVar107,1);
    auVar117 = vpinsrd_avx(auVar117,uVar107,2);
    auStack_130 = vpinsrd_avx(auVar117,uVar107,3);
    local_2ce0 = local_140._0_8_;
    uStack_2cd8 = local_140._8_8_;
    uStack_2cd0 = auStack_130._0_8_;
    uStack_2cc8 = auStack_130._8_8_;
    local_22a0._4_4_ = 0;
    local_22a0._0_4_ = local_2c24;
    local_2cf0 = local_22a0._0_8_;
    uStack_2ce8 = 0;
    local_230c = uVar107;
    local_2308 = uVar106;
    local_22a0 = ZEXT416(local_2c24);
    local_2284 = local_2c24;
    local_2280 = ZEXT416(local_2264);
    local_2260 = ZEXT416(local_2244);
    local_1a0 = local_2304;
    local_19c = local_2304;
    local_198 = local_2304;
    local_194 = local_2304;
    local_190 = local_2304;
    local_18c = local_2304;
    local_188 = local_2304;
    local_184 = local_2304;
    local_160 = uVar106;
    local_15c = uVar106;
    local_158 = uVar106;
    local_154 = uVar106;
    local_150 = uVar106;
    local_14c = uVar106;
    local_148 = uVar106;
    local_144 = uVar106;
    local_120 = uVar107;
    local_11c = uVar107;
    local_118 = uVar107;
    local_114 = uVar107;
    local_110 = uVar107;
    local_10c = uVar107;
    local_108 = uVar107;
    local_104 = uVar107;
    memset(local_2dc0,0,0xc0);
    iVar114 = (int)((ulong)in_stack_ffffffffffffb4d0 >> 0x20);
    memset(local_2e80,0,0xc0);
    local_2e84 = 0xc;
    local_2e88 = 0xc;
    prepare_coeffs_12taps(in_stack_ffffffffffffb4d8,iVar114,(__m256i *)CONCAT44(uVar107,uVar106));
    prepare_coeffs_12taps(in_stack_ffffffffffffb4d8,iVar114,(__m256i *)CONCAT44(uVar107,uVar106));
    local_2e8c = local_233c + local_2e88 + -1;
    local_2e90 = local_2e88 / 2 + -1;
    local_2e94 = local_2e84 / 2 + -1;
    local_2ea0 = (local_2320 - local_2e90 * local_2324) - (long)local_2e94;
    for (local_2ea4 = 0; local_2ea4 < local_2338; local_2ea4 = local_2ea4 + 8) {
      local_2240 = 0;
      uStack_2238 = 0;
      uStack_2230 = 0;
      uStack_2228 = 0;
      local_2ee0 = 0;
      uStack_2ed8 = 0;
      uStack_2ed0 = 0;
      uStack_2ec8 = 0;
      if (local_2338 < 5) {
        for (local_2348 = 0; local_2348 < local_2e8c; local_2348 = local_2348 + 2) {
          local_2108 = (undefined1 (*) [16])(local_2ea0 + (local_2348 * local_2324 + local_2ea4));
          local_3080 = *(undefined8 *)*local_2108;
          uStack_3078 = *(undefined8 *)(*local_2108 + 8);
          local_2110 = (undefined8 *)
                       (local_2ea0 + (local_2348 * local_2324 + local_2324 + local_2ea4));
          uStack_3070 = *local_2110;
          uStack_3068 = local_2110[1];
          local_20c0 = local_2ee0;
          uStack_20b8 = uStack_2ed8;
          uStack_20b0 = uStack_2ed0;
          uStack_20a8 = uStack_2ec8;
          auVar4._16_8_ = uStack_3070;
          auVar4._0_16_ = *local_2108;
          auVar4._24_8_ = uStack_3068;
          auVar3._8_8_ = uStack_2ed8;
          auVar3._0_8_ = local_2ee0;
          auVar3._16_8_ = uStack_2ed0;
          auVar3._24_8_ = uStack_2ec8;
          local_30a0 = vpunpcklbw_avx2(auVar4,auVar3);
          local_2040 = local_2ee0;
          uStack_2038 = uStack_2ed8;
          uStack_2030 = uStack_2ed0;
          uStack_2028 = uStack_2ec8;
          auVar8._16_8_ = uStack_3070;
          auVar8._0_16_ = *local_2108;
          auVar8._24_8_ = uStack_3068;
          auVar7._8_8_ = uStack_2ed8;
          auVar7._0_8_ = local_2ee0;
          auVar7._16_8_ = uStack_2ed0;
          auVar7._24_8_ = uStack_2ec8;
          local_30c0 = vpunpckhbw_avx2(auVar8,auVar7);
          local_1b20 = local_30a0._0_8_;
          uStack_1b18 = local_30a0._8_8_;
          uStack_1b10 = local_30a0._16_8_;
          uStack_1b08 = local_30a0._24_8_;
          local_1b40 = local_30a0._0_8_;
          uStack_1b38 = local_30a0._8_8_;
          uStack_1b30 = local_30a0._16_8_;
          uStack_1b28 = local_30a0._24_8_;
          local_30e0 = vpunpcklwd_avx2(local_30a0,local_30a0);
          local_1620 = local_30a0._0_8_;
          uStack_1618 = local_30a0._8_8_;
          uStack_1610 = local_30a0._16_8_;
          uStack_1608 = local_30a0._24_8_;
          local_1640 = local_30a0._0_8_;
          uStack_1638 = local_30a0._8_8_;
          uStack_1630 = local_30a0._16_8_;
          uStack_1628 = local_30a0._24_8_;
          local_3100 = vpunpckhwd_avx2(local_30a0,local_30a0);
          local_1b60 = local_30c0._0_8_;
          uStack_1b58 = local_30c0._8_8_;
          uStack_1b50 = local_30c0._16_8_;
          uStack_1b48 = local_30c0._24_8_;
          local_1b80 = local_30c0._0_8_;
          uStack_1b78 = local_30c0._8_8_;
          uStack_1b70 = local_30c0._16_8_;
          uStack_1b68 = local_30c0._24_8_;
          local_3120 = vpunpcklwd_avx2(local_30c0,local_30c0);
          local_1660 = local_30c0._0_8_;
          uStack_1658 = local_30c0._8_8_;
          uStack_1650 = local_30c0._16_8_;
          uStack_1648 = local_30c0._24_8_;
          local_1680 = local_30c0._0_8_;
          uStack_1678 = local_30c0._8_8_;
          uStack_1670 = local_30c0._16_8_;
          uStack_1668 = local_30c0._24_8_;
          local_3140 = vpunpckhwd_avx2(local_30c0,local_30c0);
          local_3060 = vpalignr_avx2(local_3100,local_30e0,2);
          local_3040 = vpalignr_avx2(local_3100,local_30e0,10);
          local_3020 = vpalignr_avx2(local_3120,local_3100,2);
          local_3000 = vpalignr_avx2(local_3120,local_3100,10);
          local_2fe0 = vpalignr_avx2(local_3140,local_3120,2);
          auVar118 = vpalignr_avx2(local_3140,local_3120,10);
          local_2fc0 = auVar118;
          local_2190 = uStack_3070;
          uStack_2188 = uStack_3068;
          local_2180 = local_3080;
          uStack_2178 = uStack_3078;
          local_20a0 = local_3080;
          uStack_2098 = uStack_3078;
          uStack_2090 = uStack_3070;
          uStack_2088 = uStack_3068;
          local_2020 = local_3080;
          uStack_2018 = uStack_3078;
          uStack_2010 = uStack_3070;
          uStack_2008 = uStack_3068;
          convolve_12taps(s_00,coeffs);
          local_3160._0_8_ = auVar118._0_8_;
          local_3160._8_8_ = auVar118._8_8_;
          local_3160._16_8_ = auVar118._16_8_;
          local_3160._24_8_ = auVar118._24_8_;
          local_d20 = local_3160._0_8_;
          uStack_d18 = local_3160._8_8_;
          uStack_d10 = local_3160._16_8_;
          uStack_d08 = local_3160._24_8_;
          local_d40 = local_2c60;
          uStack_d38 = uStack_2c58;
          uStack_d30 = uStack_2c50;
          uStack_d28 = uStack_2c48;
          auVar84._8_8_ = uStack_2c58;
          auVar84._0_8_ = local_2c60;
          auVar84._16_8_ = uStack_2c50;
          auVar84._24_8_ = uStack_2c48;
          local_11a0 = vpaddd_avx2(auVar118,auVar84);
          local_11b0 = local_2c70;
          uStack_11a8 = uStack_2c68;
          auVar66._8_8_ = uStack_2c68;
          auVar66._0_8_ = local_2c70;
          local_3180 = vpsrad_avx2(local_11a0,auVar66);
          local_ba0 = local_3180._0_8_;
          uStack_b98 = local_3180._8_8_;
          uStack_b90 = local_3180._16_8_;
          uStack_b88 = local_3180._24_8_;
          local_bc0 = local_3180._0_8_;
          uStack_bb8 = local_3180._8_8_;
          uStack_bb0 = local_3180._16_8_;
          uStack_ba8 = local_3180._24_8_;
          local_31a0 = vpackssdw_avx2(local_3180,local_3180);
          local_31b0 = local_31a0._0_8_;
          uStack_31a8 = local_31a0._8_8_;
          local_31c0 = local_31a0._16_8_;
          uStack_31b8 = local_31a0._24_8_;
          if (local_2338 < 3) {
            local_910 = local_31a0._0_8_;
            uStack_908 = local_31a0._8_8_;
            local_920 = local_31a0._0_8_;
            uStack_918 = local_31a0._8_8_;
            local_31c4._0_2_ = local_31a0._0_2_;
            *(undefined2 *)((long)&local_2c20 + (long)(local_2348 * local_2344) * 2) =
                 (undefined2)local_31c4;
            local_31c4._2_2_ = local_31a0._2_2_;
            *(undefined2 *)((long)&local_2c20 + (long)(local_2348 * local_2344) * 2 + 2) =
                 local_31c4._2_2_;
            local_930 = local_31a0._16_8_;
            uStack_928 = local_31a0._24_8_;
            local_940 = local_31a0._16_8_;
            uVar116 = local_940;
            uStack_938 = local_31a0._24_8_;
            local_940._0_4_ = local_31a0._16_4_;
            local_31c4 = (undefined4)local_940;
            *(short *)((long)&local_2c20 + (long)(local_2348 * local_2344 + local_2344) * 2) =
                 local_31a0._16_2_;
            *(short *)((long)&local_2c20 + (long)(local_2348 * local_2344 + local_2344 + 1) * 2) =
                 local_31a0._18_2_;
            local_940 = uVar116;
          }
          else {
            local_a48 = (undefined8 *)((long)&local_2c20 + (long)(local_2348 * local_2344) * 2);
            local_a60 = local_31a0._0_8_;
            uStack_a58 = local_31a0._8_8_;
            *local_a48 = local_31a0._0_8_;
            local_a68 = (undefined8 *)
                        ((long)&local_2c20 + (long)(local_2348 * local_2344 + local_2344) * 2);
            local_a80 = local_31a0._16_8_;
            uStack_a78 = local_31a0._24_8_;
            *local_a68 = local_31a0._16_8_;
          }
          local_3160 = auVar118;
        }
      }
      else {
        for (local_2348 = 0; local_2348 < local_2e8c; local_2348 = local_2348 + 1) {
          local_2118 = (undefined1 (*) [16])(local_2ea0 + (local_2348 * local_2324 + local_2ea4));
          local_3200 = *(undefined8 *)*local_2118;
          uStack_31f8 = *(undefined8 *)(*local_2118 + 8);
          local_2120 = (undefined8 *)((long)(local_2348 * local_2324 + local_2ea4) + 4 + local_2ea0)
          ;
          uStack_31f0 = *local_2120;
          uStack_31e8 = local_2120[1];
          local_2100 = local_2ee0;
          uStack_20f8 = uStack_2ed8;
          uStack_20f0 = uStack_2ed0;
          uStack_20e8 = uStack_2ec8;
          auVar2._16_8_ = uStack_31f0;
          auVar2._0_16_ = *local_2118;
          auVar2._24_8_ = uStack_31e8;
          auVar1._8_8_ = uStack_2ed8;
          auVar1._0_8_ = local_2ee0;
          auVar1._16_8_ = uStack_2ed0;
          auVar1._24_8_ = uStack_2ec8;
          local_3220 = vpunpcklbw_avx2(auVar2,auVar1);
          local_2080 = local_2ee0;
          uStack_2078 = uStack_2ed8;
          uStack_2070 = uStack_2ed0;
          uStack_2068 = uStack_2ec8;
          auVar6._16_8_ = uStack_31f0;
          auVar6._0_16_ = *local_2118;
          auVar6._24_8_ = uStack_31e8;
          auVar5._8_8_ = uStack_2ed8;
          auVar5._0_8_ = local_2ee0;
          auVar5._16_8_ = uStack_2ed0;
          auVar5._24_8_ = uStack_2ec8;
          local_3240 = vpunpckhbw_avx2(auVar6,auVar5);
          local_1ba0 = local_3220._0_8_;
          uStack_1b98 = local_3220._8_8_;
          uStack_1b90 = local_3220._16_8_;
          uStack_1b88 = local_3220._24_8_;
          local_1bc0 = local_3220._0_8_;
          uStack_1bb8 = local_3220._8_8_;
          uStack_1bb0 = local_3220._16_8_;
          uStack_1ba8 = local_3220._24_8_;
          local_3260 = vpunpcklwd_avx2(local_3220,local_3220);
          local_16a0 = local_3220._0_8_;
          uStack_1698 = local_3220._8_8_;
          uStack_1690 = local_3220._16_8_;
          uStack_1688 = local_3220._24_8_;
          local_16c0 = local_3220._0_8_;
          uStack_16b8 = local_3220._8_8_;
          uStack_16b0 = local_3220._16_8_;
          uStack_16a8 = local_3220._24_8_;
          local_3280 = vpunpckhwd_avx2(local_3220,local_3220);
          local_1be0 = local_3240._0_8_;
          uStack_1bd8 = local_3240._8_8_;
          uStack_1bd0 = local_3240._16_8_;
          uStack_1bc8 = local_3240._24_8_;
          local_1c00 = local_3240._0_8_;
          uStack_1bf8 = local_3240._8_8_;
          uStack_1bf0 = local_3240._16_8_;
          uStack_1be8 = local_3240._24_8_;
          local_32a0 = vpunpcklwd_avx2(local_3240,local_3240);
          local_16e0 = local_3240._0_8_;
          uStack_16d8 = local_3240._8_8_;
          uStack_16d0 = local_3240._16_8_;
          uStack_16c8 = local_3240._24_8_;
          local_1700 = local_3240._0_8_;
          uStack_16f8 = local_3240._8_8_;
          uStack_16f0 = local_3240._16_8_;
          uStack_16e8 = local_3240._24_8_;
          local_32c0 = vpunpckhwd_avx2(local_3240,local_3240);
          local_3060 = vpalignr_avx2(local_3280,local_3260,2);
          local_3040 = vpalignr_avx2(local_3280,local_3260,10);
          local_3020 = vpalignr_avx2(local_32a0,local_3280,2);
          local_3000 = vpalignr_avx2(local_32a0,local_3280,10);
          local_2fe0 = vpalignr_avx2(local_32c0,local_32a0,2);
          auVar118 = vpalignr_avx2(local_32c0,local_32a0,10);
          local_2fc0 = auVar118;
          local_21b0 = uStack_31f0;
          uStack_21a8 = uStack_31e8;
          local_21a0 = local_3200;
          uStack_2198 = uStack_31f8;
          local_20e0 = local_3200;
          uStack_20d8 = uStack_31f8;
          uStack_20d0 = uStack_31f0;
          uStack_20c8 = uStack_31e8;
          local_2060 = local_3200;
          uStack_2058 = uStack_31f8;
          uStack_2050 = uStack_31f0;
          uStack_2048 = uStack_31e8;
          convolve_12taps(s_00,coeffs);
          local_32e0._0_8_ = auVar118._0_8_;
          local_32e0._8_8_ = auVar118._8_8_;
          local_32e0._16_8_ = auVar118._16_8_;
          local_32e0._24_8_ = auVar118._24_8_;
          local_d60 = local_32e0._0_8_;
          uStack_d58 = local_32e0._8_8_;
          uStack_d50 = local_32e0._16_8_;
          uStack_d48 = local_32e0._24_8_;
          local_d80 = local_2c60;
          uStack_d78 = uStack_2c58;
          uStack_d70 = uStack_2c50;
          uStack_d68 = uStack_2c48;
          auVar83._8_8_ = uStack_2c58;
          auVar83._0_8_ = local_2c60;
          auVar83._16_8_ = uStack_2c50;
          auVar83._24_8_ = uStack_2c48;
          local_11e0 = vpaddd_avx2(auVar118,auVar83);
          local_11f0 = local_2c70;
          uStack_11e8 = uStack_2c68;
          auVar65._8_8_ = uStack_2c68;
          auVar65._0_8_ = local_2c70;
          local_3300 = vpsrad_avx2(local_11e0,auVar65);
          local_be0 = local_3300._0_8_;
          uStack_bd8 = local_3300._8_8_;
          uStack_bd0 = local_3300._16_8_;
          uStack_bc8 = local_3300._24_8_;
          local_c00 = local_3300._0_8_;
          uStack_bf8 = local_3300._8_8_;
          uStack_bf0 = local_3300._16_8_;
          uStack_be8 = local_3300._24_8_;
          local_3320 = vpackssdw_avx2(local_3300,local_3300);
          lVar110 = (long)(local_2348 * local_2344) * 2;
          local_8e8 = (undefined8 *)((long)&local_2c20 + lVar110);
          auVar119 = vpermq_avx2(local_3320,0xe8);
          local_900._0_8_ = auVar119._0_8_;
          local_900._8_8_ = auVar119._8_8_;
          *local_8e8 = local_900._0_8_;
          *(undefined8 *)((long)auStack_2c18 + lVar110) = local_900._8_8_;
          local_32e0 = auVar118;
          local_900 = auVar119._0_16_;
        }
      }
      local_7e8 = &local_2c20;
      auVar105._8_8_ = auStack_2c18[0];
      auVar105._0_8_ = local_2c20;
      auVar105._16_8_ = auStack_2c18[1];
      auVar105._24_8_ = auStack_2c18[2];
      auVar104._8_8_ = auStack_2c18[0];
      auVar104._0_8_ = local_2c20;
      auVar104._16_8_ = auStack_2c18[1];
      auVar104._24_8_ = auStack_2c18[2];
      lVar110 = (long)local_2344 * 2;
      local_7f0 = (undefined8 *)((long)&local_2c20 + lVar110);
      local_3360 = *local_7f0;
      uStack_3358 = *(undefined8 *)((long)auStack_2c18 + lVar110);
      uStack_3350 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 8);
      uStack_3348 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 0x10);
      lVar110 = (long)(local_2344 * 2) * 2;
      local_7f8 = (undefined8 *)((long)&local_2c20 + lVar110);
      local_3380 = *local_7f8;
      uStack_3378 = *(undefined8 *)((long)auStack_2c18 + lVar110);
      uStack_3370 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 8);
      uStack_3368 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 0x10);
      lVar110 = (long)(local_2344 * 3) * 2;
      local_800 = (undefined8 *)((long)&local_2c20 + lVar110);
      local_33a0 = *local_800;
      uStack_3398 = *(undefined8 *)((long)auStack_2c18 + lVar110);
      uStack_3390 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 8);
      uStack_3388 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 0x10);
      lVar110 = (long)(local_2344 << 2) * 2;
      local_808 = (undefined8 *)((long)&local_2c20 + lVar110);
      local_33c0 = *local_808;
      uStack_33b8 = *(undefined8 *)((long)auStack_2c18 + lVar110);
      uStack_33b0 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 8);
      uStack_33a8 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 0x10);
      lVar110 = (long)(local_2344 * 5) * 2;
      local_810 = (undefined8 *)((long)&local_2c20 + lVar110);
      local_33e0 = *local_810;
      uStack_33d8 = *(undefined8 *)((long)auStack_2c18 + lVar110);
      uStack_33d0 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 8);
      uStack_33c8 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 0x10);
      lVar110 = (long)(local_2344 * 6) * 2;
      local_818 = (undefined8 *)((long)&local_2c20 + lVar110);
      local_3400 = *local_818;
      uStack_33f8 = *(undefined8 *)((long)auStack_2c18 + lVar110);
      uStack_33f0 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 8);
      uStack_33e8 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 0x10);
      lVar110 = (long)(local_2344 * 7) * 2;
      local_820 = (undefined8 *)((long)&local_2c20 + lVar110);
      local_3420 = *local_820;
      uStack_3418 = *(undefined8 *)((long)auStack_2c18 + lVar110);
      uStack_3410 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 8);
      uStack_3408 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 0x10);
      lVar110 = (long)(local_2344 << 3) * 2;
      local_828 = (undefined8 *)((long)&local_2c20 + lVar110);
      local_3440 = *local_828;
      uStack_3438 = *(undefined8 *)((long)auStack_2c18 + lVar110);
      uStack_3430 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 8);
      uStack_3428 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 0x10);
      lVar110 = (long)(local_2344 * 9) * 2;
      local_830 = (undefined8 *)((long)&local_2c20 + lVar110);
      local_3460 = *local_830;
      uStack_3458 = *(undefined8 *)((long)auStack_2c18 + lVar110);
      uStack_3450 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 8);
      uStack_3448 = *(undefined8 *)((long)auStack_2c18 + lVar110 + 0x10);
      auVar28._8_8_ = uStack_3358;
      auVar28._0_8_ = local_3360;
      auVar28._16_8_ = uStack_3350;
      auVar28._24_8_ = uStack_3348;
      local_3060 = vpunpcklwd_avx2(auVar104,auVar28);
      auVar27._8_8_ = uStack_3378;
      auVar27._0_8_ = local_3380;
      auVar27._16_8_ = uStack_3370;
      auVar27._24_8_ = uStack_3368;
      auVar26._8_8_ = uStack_3398;
      auVar26._0_8_ = local_33a0;
      auVar26._16_8_ = uStack_3390;
      auVar26._24_8_ = uStack_3388;
      local_3040 = vpunpcklwd_avx2(auVar27,auVar26);
      auVar25._8_8_ = uStack_33b8;
      auVar25._0_8_ = local_33c0;
      auVar25._16_8_ = uStack_33b0;
      auVar25._24_8_ = uStack_33a8;
      auVar24._8_8_ = uStack_33d8;
      auVar24._0_8_ = local_33e0;
      auVar24._16_8_ = uStack_33d0;
      auVar24._24_8_ = uStack_33c8;
      local_3020 = vpunpcklwd_avx2(auVar25,auVar24);
      auVar23._8_8_ = uStack_33f8;
      auVar23._0_8_ = local_3400;
      auVar23._16_8_ = uStack_33f0;
      auVar23._24_8_ = uStack_33e8;
      auVar22._8_8_ = uStack_3418;
      auVar22._0_8_ = local_3420;
      auVar22._16_8_ = uStack_3410;
      auVar22._24_8_ = uStack_3408;
      local_3000 = vpunpcklwd_avx2(auVar23,auVar22);
      auVar21._8_8_ = uStack_3438;
      auVar21._0_8_ = local_3440;
      auVar21._16_8_ = uStack_3430;
      auVar21._24_8_ = uStack_3428;
      auVar20._8_8_ = uStack_3458;
      auVar20._0_8_ = local_3460;
      auVar20._16_8_ = uStack_3450;
      auVar20._24_8_ = uStack_3448;
      local_2fe0 = vpunpcklwd_avx2(auVar21,auVar20);
      auVar48._8_8_ = uStack_3358;
      auVar48._0_8_ = local_3360;
      auVar48._16_8_ = uStack_3350;
      auVar48._24_8_ = uStack_3348;
      local_2fa0 = vpunpckhwd_avx2(auVar105,auVar48);
      auVar47._8_8_ = uStack_3378;
      auVar47._0_8_ = local_3380;
      auVar47._16_8_ = uStack_3370;
      auVar47._24_8_ = uStack_3368;
      auVar46._8_8_ = uStack_3398;
      auVar46._0_8_ = local_33a0;
      auVar46._16_8_ = uStack_3390;
      auVar46._24_8_ = uStack_3388;
      local_2f80 = vpunpckhwd_avx2(auVar47,auVar46);
      auVar45._8_8_ = uStack_33b8;
      auVar45._0_8_ = local_33c0;
      auVar45._16_8_ = uStack_33b0;
      auVar45._24_8_ = uStack_33a8;
      auVar44._8_8_ = uStack_33d8;
      auVar44._0_8_ = local_33e0;
      auVar44._16_8_ = uStack_33d0;
      auVar44._24_8_ = uStack_33c8;
      local_2f60 = vpunpckhwd_avx2(auVar45,auVar44);
      auVar43._8_8_ = uStack_33f8;
      auVar43._0_8_ = local_3400;
      auVar43._16_8_ = uStack_33f0;
      auVar43._24_8_ = uStack_33e8;
      auVar42._8_8_ = uStack_3418;
      auVar42._0_8_ = local_3420;
      auVar42._16_8_ = uStack_3410;
      auVar42._24_8_ = uStack_3408;
      local_2f40 = vpunpckhwd_avx2(auVar43,auVar42);
      auVar41._8_8_ = uStack_3438;
      auVar41._0_8_ = local_3440;
      auVar41._16_8_ = uStack_3430;
      auVar41._24_8_ = uStack_3428;
      auVar40._8_8_ = uStack_3458;
      auVar40._0_8_ = local_3460;
      auVar40._16_8_ = uStack_3450;
      auVar40._24_8_ = uStack_3448;
      local_2f20 = vpunpckhwd_avx2(auVar41,auVar40);
      local_1d40 = local_3460;
      uStack_1d38 = uStack_3458;
      uStack_1d30 = uStack_3450;
      uStack_1d28 = uStack_3448;
      local_1d20 = local_3440;
      uStack_1d18 = uStack_3438;
      uStack_1d10 = uStack_3430;
      uStack_1d08 = uStack_3428;
      local_1d00 = local_3420;
      uStack_1cf8 = uStack_3418;
      uStack_1cf0 = uStack_3410;
      uStack_1ce8 = uStack_3408;
      local_1ce0 = local_3400;
      uStack_1cd8 = uStack_33f8;
      uStack_1cd0 = uStack_33f0;
      uStack_1cc8 = uStack_33e8;
      local_1cc0 = local_33e0;
      uStack_1cb8 = uStack_33d8;
      uStack_1cb0 = uStack_33d0;
      uStack_1ca8 = uStack_33c8;
      local_1ca0 = local_33c0;
      uStack_1c98 = uStack_33b8;
      uStack_1c90 = uStack_33b0;
      uStack_1c88 = uStack_33a8;
      local_1c80 = local_33a0;
      uStack_1c78 = uStack_3398;
      uStack_1c70 = uStack_3390;
      uStack_1c68 = uStack_3388;
      local_1c60 = local_3380;
      uStack_1c58 = uStack_3378;
      uStack_1c50 = uStack_3370;
      uStack_1c48 = uStack_3368;
      local_1c40 = local_3360;
      uStack_1c38 = uStack_3358;
      uStack_1c30 = uStack_3350;
      uStack_1c28 = uStack_3348;
      local_1840 = local_3460;
      uStack_1838 = uStack_3458;
      uStack_1830 = uStack_3450;
      uStack_1828 = uStack_3448;
      local_1820 = local_3440;
      uStack_1818 = uStack_3438;
      uStack_1810 = uStack_3430;
      uStack_1808 = uStack_3428;
      local_1800 = local_3420;
      uStack_17f8 = uStack_3418;
      uStack_17f0 = uStack_3410;
      uStack_17e8 = uStack_3408;
      local_17e0 = local_3400;
      uStack_17d8 = uStack_33f8;
      uStack_17d0 = uStack_33f0;
      uStack_17c8 = uStack_33e8;
      local_17c0 = local_33e0;
      uStack_17b8 = uStack_33d8;
      uStack_17b0 = uStack_33d0;
      uStack_17a8 = uStack_33c8;
      local_17a0 = local_33c0;
      uStack_1798 = uStack_33b8;
      uStack_1790 = uStack_33b0;
      uStack_1788 = uStack_33a8;
      local_1780 = local_33a0;
      uStack_1778 = uStack_3398;
      uStack_1770 = uStack_3390;
      uStack_1768 = uStack_3388;
      local_1760 = local_3380;
      uStack_1758 = uStack_3378;
      uStack_1750 = uStack_3370;
      uStack_1748 = uStack_3368;
      local_1740 = local_3360;
      uStack_1738 = uStack_3358;
      uStack_1730 = uStack_3350;
      uStack_1728 = uStack_3348;
      for (local_2348 = 0; local_2348 < local_233c; local_2348 = local_2348 + 2) {
        local_3468 = (long)&local_2c20 + (long)(local_2348 * local_2344) * 2;
        local_838 = (undefined1 (*) [32])(local_3468 + (long)(local_2344 * 10) * 2);
        local_34a0 = *(undefined8 *)*local_838;
        uStack_3498 = *(undefined8 *)(*local_838 + 8);
        uStack_3490 = *(undefined8 *)(*local_838 + 0x10);
        uStack_3488 = *(undefined8 *)(*local_838 + 0x18);
        local_840 = (undefined1 (*) [32])(local_3468 + (long)(local_2344 * 0xb) * 2);
        local_34c0 = *(undefined8 *)*local_840;
        uStack_34b8 = *(undefined8 *)(*local_840 + 8);
        uStack_34b0 = *(undefined8 *)(*local_840 + 0x10);
        uStack_34a8 = *(undefined8 *)(*local_840 + 0x18);
        local_2fc0 = vpunpcklwd_avx2(*local_838,*local_840);
        auVar118 = vpunpckhwd_avx2(*local_838,*local_840);
        puVar115 = local_2e80;
        local_2f00 = auVar118;
        local_1d80 = local_34c0;
        uStack_1d78 = uStack_34b8;
        uStack_1d70 = uStack_34b0;
        uStack_1d68 = uStack_34a8;
        local_1d60 = local_34a0;
        uStack_1d58 = uStack_3498;
        uStack_1d50 = uStack_3490;
        uStack_1d48 = uStack_3488;
        local_1880 = local_34c0;
        uStack_1878 = uStack_34b8;
        uStack_1870 = uStack_34b0;
        uStack_1868 = uStack_34a8;
        local_1860 = local_34a0;
        uStack_1858 = uStack_3498;
        uStack_1850 = uStack_3490;
        uStack_1848 = uStack_3488;
        convolve_12taps(s_00,coeffs);
        local_34e0 = auVar118;
        convolve_12taps(s_00,coeffs);
        local_da0 = local_34e0._0_8_;
        uStack_d98 = local_34e0._8_8_;
        uStack_d90 = local_34e0._16_8_;
        uStack_d88 = local_34e0._24_8_;
        local_dc0 = local_2ca0;
        uStack_db8 = uStack_2c98;
        uStack_db0 = uStack_2c90;
        uStack_da8 = uStack_2c88;
        auVar82._8_8_ = uStack_2c98;
        auVar82._0_8_ = local_2ca0;
        auVar82._16_8_ = uStack_2c90;
        auVar82._24_8_ = uStack_2c88;
        local_1220 = vpaddd_avx2(local_34e0,auVar82);
        local_1230 = local_2cb0;
        uStack_1228 = uStack_2ca8;
        auVar64._8_8_ = uStack_2ca8;
        auVar64._0_8_ = local_2cb0;
        local_34e0 = vpsrad_avx2(local_1220,auVar64);
        local_3500._0_8_ = auVar118._0_8_;
        local_3500._8_8_ = auVar118._8_8_;
        local_3500._16_8_ = auVar118._16_8_;
        local_3500._24_8_ = auVar118._24_8_;
        local_de0 = local_3500._0_8_;
        uStack_dd8 = local_3500._8_8_;
        uStack_dd0 = local_3500._16_8_;
        uStack_dc8 = local_3500._24_8_;
        local_e00 = local_2ca0;
        uStack_df8 = uStack_2c98;
        uStack_df0 = uStack_2c90;
        uStack_de8 = uStack_2c88;
        auVar81._8_8_ = uStack_2c98;
        auVar81._0_8_ = local_2ca0;
        auVar81._16_8_ = uStack_2c90;
        auVar81._24_8_ = uStack_2c88;
        local_1260 = vpaddd_avx2(auVar118,auVar81);
        local_1270 = local_2cb0;
        uStack_1268 = uStack_2ca8;
        auVar63._8_8_ = uStack_2ca8;
        auVar63._0_8_ = local_2cb0;
        local_3500 = vpsrad_avx2(local_1260,auVar63);
        local_e20 = local_34e0._0_8_;
        uStack_e18 = local_34e0._8_8_;
        uStack_e10 = local_34e0._16_8_;
        uStack_e08 = local_34e0._24_8_;
        local_e40 = local_2ce0;
        uStack_e38 = uStack_2cd8;
        uStack_e30 = uStack_2cd0;
        uStack_e28 = uStack_2cc8;
        auVar80._8_8_ = uStack_2cd8;
        auVar80._0_8_ = local_2ce0;
        auVar80._16_8_ = uStack_2cd0;
        auVar80._24_8_ = uStack_2cc8;
        local_12a0 = vpaddd_avx2(local_34e0,auVar80);
        local_12b0 = local_2cf0;
        uStack_12a8 = uStack_2ce8;
        auVar62._8_8_ = uStack_2ce8;
        auVar62._0_8_ = local_2cf0;
        local_3520 = vpsrad_avx2(local_12a0,auVar62);
        local_e60 = local_3500._0_8_;
        uStack_e58 = local_3500._8_8_;
        uStack_e50 = local_3500._16_8_;
        uStack_e48 = local_3500._24_8_;
        local_e80 = local_2ce0;
        uStack_e78 = uStack_2cd8;
        uStack_e70 = uStack_2cd0;
        uStack_e68 = uStack_2cc8;
        auVar79._8_8_ = uStack_2cd8;
        auVar79._0_8_ = local_2ce0;
        auVar79._16_8_ = uStack_2cd0;
        auVar79._24_8_ = uStack_2cc8;
        local_12e0 = vpaddd_avx2(local_3500,auVar79);
        local_12f0 = local_2cf0;
        uStack_12e8 = uStack_2ce8;
        auVar61._8_8_ = uStack_2ce8;
        auVar61._0_8_ = local_2cf0;
        local_3540 = vpsrad_avx2(local_12e0,auVar61);
        local_c20 = local_3520._0_8_;
        uStack_c18 = local_3520._8_8_;
        uStack_c10 = local_3520._16_8_;
        uStack_c08 = local_3520._24_8_;
        local_c40 = local_3540._0_8_;
        uStack_c38 = local_3540._8_8_;
        uStack_c30 = local_3540._16_8_;
        uStack_c28 = local_3540._24_8_;
        local_3560 = vpackssdw_avx2(local_3520,local_3540);
        local_700 = local_3560._0_8_;
        uStack_6f8 = local_3560._8_8_;
        uStack_6f0 = local_3560._16_8_;
        uStack_6e8 = local_3560._24_8_;
        local_720 = local_3560._0_8_;
        uStack_718 = local_3560._8_8_;
        uStack_710 = local_3560._16_8_;
        uStack_708 = local_3560._24_8_;
        local_3580 = vpackuswb_avx2(local_3560,local_3560);
        local_680 = local_3580._0_8_;
        uStack_678 = local_3580._8_8_;
        uStack_670 = local_3580._16_8_;
        uStack_668 = local_3580._24_8_;
        local_3590 = local_3580._0_8_;
        uStack_3588 = local_3580._8_8_;
        local_35a0 = local_3580._16_8_;
        uStack_3598 = local_3580._24_8_;
        local_35a8 = (undefined8 *)(local_2330 + (local_2348 * local_2334 + local_2ea4));
        local_35b0 = (undefined8 *)
                     (local_2330 + (local_2348 * local_2334 + local_2ea4 + local_2334));
        if (local_2338 - local_2ea4 < 5) {
          if (local_2338 == 4) {
            v[1] = extraout_RDX;
            v[0] = (longlong)puVar115;
            xx_storel_32(local_35a8,v);
            v_00[1] = extraout_RDX_00;
            v_00[0] = (longlong)puVar115;
            xx_storel_32(local_35b0,v_00);
          }
          else {
            local_950 = local_3580._0_8_;
            uStack_948 = local_3580._8_8_;
            local_960 = local_3580._0_8_;
            uStack_958 = local_3580._8_8_;
            *(short *)local_35a8 = local_3580._0_2_;
            local_970 = local_3580._16_8_;
            uStack_968 = local_3580._24_8_;
            local_980 = local_3580._16_8_;
            uStack_978 = local_3580._24_8_;
            *(short *)local_35b0 = local_3580._16_2_;
          }
        }
        else {
          local_aa0 = local_3580._0_8_;
          uStack_a98 = local_3580._8_8_;
          *local_35a8 = local_3580._0_8_;
          local_ac0 = local_3580._16_8_;
          uStack_ab8 = local_3580._24_8_;
          *local_35b0 = local_3580._16_8_;
          local_aa8 = local_35b0;
          local_a88 = local_35a8;
        }
        local_3060 = local_3040;
        local_3040 = local_3020;
        local_3020 = local_3000;
        local_3000 = local_2fe0;
        local_2fe0 = local_2fc0;
        local_2fa0 = local_2f80;
        local_2f80 = local_2f60;
        local_2f60 = local_2f40;
        local_2f40 = local_2f20;
        local_2f20 = local_2f00;
      }
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_general_avx2(
    const uint8_t *src, int src_stride, uint8_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params) {
  if (filter_params_x->taps > 8) {
    const int bd = 8;
    int im_stride = 8, i;
    DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
    const int bits =
        FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
    const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;

    assert(conv_params->round_0 > 0);

    const __m256i round_const_h12 = _mm256_set1_epi32(
        ((1 << (conv_params->round_0)) >> 1) + (1 << (bd + FILTER_BITS - 1)));
    const __m128i round_shift_h12 = _mm_cvtsi32_si128(conv_params->round_0);

    const __m256i sum_round_v = _mm256_set1_epi32(
        (1 << offset_bits) + ((1 << conv_params->round_1) >> 1));
    const __m128i sum_shift_v = _mm_cvtsi32_si128(conv_params->round_1);

    const __m256i round_const_v = _mm256_set1_epi32(
        ((1 << bits) >> 1) - (1 << (offset_bits - conv_params->round_1)) -
        ((1 << (offset_bits - conv_params->round_1)) >> 1));
    const __m128i round_shift_v = _mm_cvtsi32_si128(bits);

    __m256i coeffs_h[6] = { 0 }, coeffs_v[6] = { 0 };

    int horiz_tap = 12;
    int vert_tap = 12;

    prepare_coeffs_12taps(filter_params_x, subpel_x_qn, coeffs_h);
    prepare_coeffs_12taps(filter_params_y, subpel_y_qn, coeffs_v);

    int im_h = h + vert_tap - 1;
    const int fo_vert = vert_tap / 2 - 1;
    const int fo_horiz = horiz_tap / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    for (int j = 0; j < w; j += 8) {
      CONVOLVE_SR_HORIZONTAL_FILTER_12TAP
      CONVOLVE_SR_VERTICAL_FILTER_12TAP
    }
  } else {
    const int bd = 8;
    int im_stride = 8, i;
    DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
    const int bits =
        FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
    const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;

    assert(conv_params->round_0 > 0);

    const __m256i round_const_h =
        _mm256_set1_epi16(((1 << (conv_params->round_0 - 1)) >> 1) +
                          (1 << (bd + FILTER_BITS - 2)));
    const __m128i round_shift_h = _mm_cvtsi32_si128(conv_params->round_0 - 1);

    const __m256i sum_round_v = _mm256_set1_epi32(
        (1 << offset_bits) + ((1 << conv_params->round_1) >> 1));
    const __m128i sum_shift_v = _mm_cvtsi32_si128(conv_params->round_1);

    const __m256i round_const_v = _mm256_set1_epi32(
        ((1 << bits) >> 1) - (1 << (offset_bits - conv_params->round_1)) -
        ((1 << (offset_bits - conv_params->round_1)) >> 1));
    const __m128i round_shift_v = _mm_cvtsi32_si128(bits);

    __m256i filt[4], coeffs_h[4], coeffs_v[4];

    prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs_h);
    prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_v);

    int horiz_tap = get_filter_tap(filter_params_x, subpel_x_qn);
    int vert_tap = get_filter_tap(filter_params_y, subpel_y_qn);

    if (horiz_tap == 6)
      prepare_coeffs_6t_lowbd(filter_params_x, subpel_x_qn, coeffs_h);
    else
      prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs_h);

    if (vert_tap == 6)
      prepare_coeffs_6t(filter_params_y, subpel_y_qn, coeffs_v);
    else
      prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_v);

    int im_h = h + vert_tap - 1;
    const int fo_vert = vert_tap / 2 - 1;
    const int fo_horiz = horiz_tap / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    filt[0] = _mm256_load_si256((__m256i const *)filt1_global_avx2);
    filt[1] = _mm256_load_si256((__m256i const *)filt2_global_avx2);
    filt[2] = _mm256_load_si256((__m256i const *)filt3_global_avx2);
    filt[3] = _mm256_load_si256((__m256i const *)filt4_global_avx2);

    for (int j = 0; j < w; j += 8) {
      if (horiz_tap == 4) {
        CONVOLVE_SR_HORIZONTAL_FILTER_4TAP
      } else if (horiz_tap == 6) {
        CONVOLVE_SR_HORIZONTAL_FILTER_6TAP
      } else {
        CONVOLVE_SR_HORIZONTAL_FILTER_8TAP
      }

      if (vert_tap == 4) {
        CONVOLVE_SR_VERTICAL_FILTER_4TAP
      } else if (vert_tap == 6) {
        CONVOLVE_SR_VERTICAL_FILTER_6TAP
      } else {
        CONVOLVE_SR_VERTICAL_FILTER_8TAP
      }
    }
  }
}